

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O2

bool embree::avx2::CurveNiIntersector1<8>::
     occluded_t<embree::avx2::RibbonCurve1Intersector1<embree::BezierCurveT,8>,embree::avx2::Occluded1EpilogMU<8,true>>
               (Precalculations *pre,Ray *ray,RayQueryContext *context,Primitive *prim)

{
  undefined1 (*pauVar1) [16];
  undefined1 (*pauVar2) [16];
  undefined1 (*pauVar3) [16];
  undefined1 (*pauVar4) [12];
  undefined1 (*pauVar5) [28];
  float *pfVar6;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar7;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar8;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  Primitive PVar18;
  int iVar19;
  Geometry *pGVar20;
  RTCFilterFunctionN p_Var21;
  undefined1 auVar22 [32];
  float fVar23;
  undefined1 auVar24 [16];
  long lVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  float fVar84;
  float fVar85;
  float fVar86;
  float fVar87;
  float fVar88;
  float fVar89;
  float fVar90;
  float fVar91;
  float fVar92;
  float fVar93;
  float fVar94;
  float fVar95;
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [28];
  uint uVar105;
  RTCIntersectArguments *pRVar106;
  ulong uVar107;
  Geometry *geometry;
  long lVar108;
  ulong uVar109;
  long lVar110;
  byte bVar111;
  undefined4 uVar112;
  undefined8 unaff_R14;
  ulong uVar113;
  float fVar125;
  undefined8 uVar114;
  undefined1 auVar115 [16];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar126 [16];
  float fVar138;
  float fVar140;
  float fVar141;
  float fVar142;
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  float fVar139;
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [64];
  undefined1 auVar144 [16];
  float fVar143;
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  undefined1 auVar160 [64];
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [32];
  undefined1 auVar169 [32];
  undefined1 auVar170 [32];
  undefined1 auVar171 [32];
  undefined1 auVar172 [16];
  undefined1 auVar173 [32];
  undefined1 auVar175 [32];
  undefined1 auVar176 [32];
  undefined1 auVar177 [32];
  undefined1 auVar174 [32];
  undefined1 auVar178 [64];
  undefined1 auVar179 [64];
  undefined1 auVar180 [16];
  undefined1 auVar181 [64];
  undefined1 auVar182 [64];
  undefined1 auVar183 [32];
  undefined1 auVar184 [32];
  undefined1 auVar185 [64];
  undefined1 auVar188 [32];
  undefined1 auVar189 [32];
  undefined1 auVar190 [32];
  undefined1 auVar191 [32];
  undefined1 auVar186 [32];
  undefined1 in_ZMM9 [64];
  undefined1 auVar192 [64];
  undefined1 auVar193 [16];
  undefined1 in_ZMM10 [64];
  undefined1 auVar194 [64];
  undefined1 auVar195 [32];
  undefined1 auVar196 [32];
  undefined1 auVar197 [32];
  undefined1 auVar198 [64];
  undefined1 auVar199 [16];
  undefined1 auVar200 [32];
  undefined1 auVar201 [32];
  undefined1 auVar202 [32];
  undefined1 auVar203 [64];
  undefined1 auVar204 [64];
  float fVar205;
  float fVar207;
  undefined1 auVar206 [16];
  undefined8 uVar208;
  undefined1 auVar209 [32];
  undefined1 auVar210 [32];
  undefined1 auVar211 [32];
  undefined1 auVar212 [32];
  undefined1 auVar214 [32];
  undefined1 auVar215 [32];
  undefined1 auVar216 [64];
  RTCFilterFunctionNArguments args;
  int local_7b4;
  long local_7b0;
  Primitive *local_7a8;
  undefined1 local_7a0 [8];
  undefined1 auStack_798 [8];
  float fStack_790;
  float fStack_78c;
  float fStack_788;
  undefined1 local_780 [32];
  undefined1 local_760 [32];
  ulong local_730;
  Precalculations *local_728;
  undefined1 local_720 [32];
  undefined1 local_700 [32];
  undefined1 local_6e0 [32];
  undefined1 local_6c0 [32];
  undefined1 local_6a0 [32];
  undefined1 local_680 [32];
  undefined1 local_660 [32];
  undefined1 local_640 [32];
  undefined8 local_620;
  undefined8 uStack_618;
  undefined8 local_610;
  undefined8 uStack_608;
  undefined8 local_600;
  undefined8 uStack_5f8;
  RTCFilterFunctionNArguments local_5f0;
  undefined1 local_5c0 [32];
  float local_5a0;
  float fStack_59c;
  float fStack_598;
  float fStack_594;
  float fStack_590;
  float fStack_58c;
  float fStack_588;
  float fStack_584;
  float local_580;
  float fStack_57c;
  float fStack_578;
  float fStack_574;
  float fStack_570;
  float fStack_56c;
  float fStack_568;
  float fStack_564;
  undefined8 local_560;
  undefined8 uStack_558;
  undefined8 uStack_550;
  undefined8 uStack_548;
  undefined1 local_540 [32];
  undefined1 local_520 [32];
  undefined8 local_500;
  undefined4 local_4f8;
  float local_4f4;
  undefined4 local_4f0;
  undefined4 local_4ec;
  undefined4 local_4e8;
  uint local_4e4;
  uint local_4e0;
  ulong local_4c8;
  float local_4c0;
  float fStack_4bc;
  float fStack_4b8;
  float fStack_4b4;
  ulong local_4a8;
  undefined8 local_4a0;
  undefined8 uStack_498;
  undefined8 uStack_490;
  undefined8 uStack_488;
  undefined1 local_480 [32];
  undefined1 local_460 [8];
  float fStack_458;
  float fStack_454;
  float fStack_450;
  float fStack_44c;
  float fStack_448;
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  undefined1 local_400 [32];
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [32];
  undefined1 local_380 [32];
  undefined1 local_360 [32];
  undefined1 local_340 [32];
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  int local_260;
  int local_25c;
  undefined8 local_250;
  undefined8 uStack_248;
  undefined8 local_240;
  undefined8 uStack_238;
  undefined8 local_230;
  undefined8 uStack_228;
  float local_1e0 [4];
  float fStack_1d0;
  float fStack_1cc;
  float fStack_1c8;
  float fStack_1c4;
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  undefined8 uStack_1b0;
  undefined8 uStack_1a8;
  undefined1 local_1a0 [32];
  float local_180;
  float fStack_17c;
  float fStack_178;
  float fStack_174;
  float fStack_170;
  float fStack_16c;
  float fStack_168;
  float fStack_164;
  undefined8 local_160;
  undefined8 uStack_158;
  undefined8 uStack_150;
  undefined8 uStack_148;
  undefined4 local_140;
  undefined4 uStack_13c;
  undefined4 uStack_138;
  undefined4 uStack_134;
  undefined4 uStack_130;
  undefined4 uStack_12c;
  undefined4 uStack_128;
  undefined4 uStack_124;
  undefined1 local_120 [32];
  undefined8 local_100;
  undefined8 uStack_f8;
  undefined8 uStack_f0;
  undefined8 uStack_e8;
  undefined1 local_e0 [32];
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  undefined1 auVar187 [32];
  undefined1 auVar213 [64];
  
  local_728 = pre;
  PVar18 = prim[1];
  uVar107 = (ulong)(byte)PVar18;
  auVar24 = vsubps_avx((undefined1  [16])(ray->org).field_0,
                       *(undefined1 (*) [16])(prim + uVar107 * 0x19 + 6));
  fVar143 = *(float *)(prim + uVar107 * 0x19 + 0x12);
  auVar115._0_4_ = fVar143 * auVar24._0_4_;
  auVar115._4_4_ = fVar143 * auVar24._4_4_;
  auVar115._8_4_ = fVar143 * auVar24._8_4_;
  auVar115._12_4_ = fVar143 * auVar24._12_4_;
  auVar163._0_4_ = fVar143 * (ray->dir).field_0.m128[0];
  auVar163._4_4_ = fVar143 * (ray->dir).field_0.m128[1];
  auVar163._8_4_ = fVar143 * (ray->dir).field_0.m128[2];
  auVar163._12_4_ = fVar143 * (ray->dir).field_0.m128[3];
  auVar24._8_8_ = 0;
  auVar24._0_8_ = *(ulong *)(prim + uVar107 * 4 + 6);
  auVar135 = vpmovsxbd_avx2(auVar24);
  auVar135 = vcvtdq2ps_avx(auVar135);
  auVar10._8_8_ = 0;
  auVar10._0_8_ = *(ulong *)(prim + uVar107 * 5 + 6);
  auVar195 = vpmovsxbd_avx2(auVar10);
  auVar195 = vcvtdq2ps_avx(auVar195);
  auVar11._8_8_ = 0;
  auVar11._0_8_ = *(ulong *)(prim + uVar107 * 6 + 6);
  auVar133 = vpmovsxbd_avx2(auVar11);
  auVar133 = vcvtdq2ps_avx(auVar133);
  auVar12._8_8_ = 0;
  auVar12._0_8_ = *(ulong *)(prim + uVar107 * 0xb + 6);
  auVar152 = vpmovsxbd_avx2(auVar12);
  auVar152 = vcvtdq2ps_avx(auVar152);
  auVar13._8_8_ = 0;
  auVar13._0_8_ = *(ulong *)(prim + uVar107 * 0xc + 6);
  auVar154 = vpmovsxbd_avx2(auVar13);
  auVar154 = vcvtdq2ps_avx(auVar154);
  auVar14._8_8_ = 0;
  auVar14._0_8_ = *(ulong *)(prim + uVar107 * 0xd + 6);
  auVar120 = vpmovsxbd_avx2(auVar14);
  auVar120 = vcvtdq2ps_avx(auVar120);
  auVar203 = ZEXT3264(auVar120);
  auVar15._8_8_ = 0;
  auVar15._0_8_ = *(ulong *)(prim + uVar107 * 0x12 + 6);
  auVar151 = vpmovsxbd_avx2(auVar15);
  auVar151 = vcvtdq2ps_avx(auVar151);
  auVar16._8_8_ = 0;
  auVar16._0_8_ = *(ulong *)(prim + uVar107 * 0x13 + 6);
  auVar124 = vpmovsxbd_avx2(auVar16);
  auVar124 = vcvtdq2ps_avx(auVar124);
  auVar198 = ZEXT3264(auVar124);
  auVar17._8_8_ = 0;
  auVar17._0_8_ = *(ulong *)(prim + uVar107 * 0x14 + 6);
  auVar189 = vpmovsxbd_avx2(auVar17);
  auVar189 = vcvtdq2ps_avx(auVar189);
  auVar209._4_4_ = auVar163._0_4_;
  auVar209._0_4_ = auVar163._0_4_;
  auVar209._8_4_ = auVar163._0_4_;
  auVar209._12_4_ = auVar163._0_4_;
  auVar209._16_4_ = auVar163._0_4_;
  auVar209._20_4_ = auVar163._0_4_;
  auVar209._24_4_ = auVar163._0_4_;
  auVar209._28_4_ = auVar163._0_4_;
  auVar24 = vmovshdup_avx(auVar163);
  uVar114 = auVar24._0_8_;
  auVar214._8_8_ = uVar114;
  auVar214._0_8_ = uVar114;
  auVar214._16_8_ = uVar114;
  auVar214._24_8_ = uVar114;
  auVar24 = vshufps_avx(auVar163,auVar163,0xaa);
  fVar143 = auVar24._0_4_;
  auVar194._0_4_ = fVar143 * auVar133._0_4_;
  fVar125 = auVar24._4_4_;
  auVar194._4_4_ = fVar125 * auVar133._4_4_;
  auVar194._8_4_ = fVar143 * auVar133._8_4_;
  auVar194._12_4_ = fVar125 * auVar133._12_4_;
  auVar194._16_4_ = fVar143 * auVar133._16_4_;
  auVar194._20_4_ = fVar125 * auVar133._20_4_;
  auVar194._28_36_ = in_ZMM10._28_36_;
  auVar194._24_4_ = fVar143 * auVar133._24_4_;
  auVar192._0_4_ = auVar120._0_4_ * fVar143;
  auVar192._4_4_ = auVar120._4_4_ * fVar125;
  auVar192._8_4_ = auVar120._8_4_ * fVar143;
  auVar192._12_4_ = auVar120._12_4_ * fVar125;
  auVar192._16_4_ = auVar120._16_4_ * fVar143;
  auVar192._20_4_ = auVar120._20_4_ * fVar125;
  auVar192._28_36_ = in_ZMM9._28_36_;
  auVar192._24_4_ = auVar120._24_4_ * fVar143;
  auVar117._0_4_ = auVar189._0_4_ * fVar143;
  auVar117._4_4_ = auVar189._4_4_ * fVar125;
  auVar117._8_4_ = auVar189._8_4_ * fVar143;
  auVar117._12_4_ = auVar189._12_4_ * fVar125;
  auVar117._16_4_ = auVar189._16_4_ * fVar143;
  auVar117._20_4_ = auVar189._20_4_ * fVar125;
  auVar117._24_4_ = auVar189._24_4_ * fVar143;
  auVar117._28_4_ = 0;
  auVar24 = vfmadd231ps_fma(auVar194._0_32_,auVar214,auVar195);
  auVar10 = vfmadd231ps_fma(auVar192._0_32_,auVar214,auVar154);
  auVar11 = vfmadd231ps_fma(auVar117,auVar124,auVar214);
  auVar12 = vfmadd231ps_fma(ZEXT1632(auVar24),auVar209,auVar135);
  auVar194 = ZEXT1664(auVar12);
  auVar10 = vfmadd231ps_fma(ZEXT1632(auVar10),auVar209,auVar152);
  auVar11 = vfmadd231ps_fma(ZEXT1632(auVar11),auVar151,auVar209);
  auVar210._4_4_ = auVar115._0_4_;
  auVar210._0_4_ = auVar115._0_4_;
  auVar210._8_4_ = auVar115._0_4_;
  auVar210._12_4_ = auVar115._0_4_;
  auVar210._16_4_ = auVar115._0_4_;
  auVar210._20_4_ = auVar115._0_4_;
  auVar210._24_4_ = auVar115._0_4_;
  auVar210._28_4_ = auVar115._0_4_;
  auVar213 = ZEXT3264(auVar210);
  auVar24 = vmovshdup_avx(auVar115);
  uVar114 = auVar24._0_8_;
  auVar215._8_8_ = uVar114;
  auVar215._0_8_ = uVar114;
  auVar215._16_8_ = uVar114;
  auVar215._24_8_ = uVar114;
  auVar24 = vshufps_avx(auVar115,auVar115,0xaa);
  fVar143 = auVar24._0_4_;
  auVar168._0_4_ = fVar143 * auVar133._0_4_;
  fVar125 = auVar24._4_4_;
  auVar168._4_4_ = fVar125 * auVar133._4_4_;
  auVar168._8_4_ = fVar143 * auVar133._8_4_;
  auVar168._12_4_ = fVar125 * auVar133._12_4_;
  auVar168._16_4_ = fVar143 * auVar133._16_4_;
  auVar168._20_4_ = fVar125 * auVar133._20_4_;
  auVar168._24_4_ = fVar143 * auVar133._24_4_;
  auVar168._28_4_ = 0;
  auVar22._4_4_ = auVar120._4_4_ * fVar125;
  auVar22._0_4_ = auVar120._0_4_ * fVar143;
  auVar22._8_4_ = auVar120._8_4_ * fVar143;
  auVar22._12_4_ = auVar120._12_4_ * fVar125;
  auVar22._16_4_ = auVar120._16_4_ * fVar143;
  auVar22._20_4_ = auVar120._20_4_ * fVar125;
  auVar22._24_4_ = auVar120._24_4_ * fVar143;
  auVar22._28_4_ = auVar133._28_4_;
  auVar133._4_4_ = auVar189._4_4_ * fVar125;
  auVar133._0_4_ = auVar189._0_4_ * fVar143;
  auVar133._8_4_ = auVar189._8_4_ * fVar143;
  auVar133._12_4_ = auVar189._12_4_ * fVar125;
  auVar133._16_4_ = auVar189._16_4_ * fVar143;
  auVar133._20_4_ = auVar189._20_4_ * fVar125;
  auVar133._24_4_ = auVar189._24_4_ * fVar143;
  auVar133._28_4_ = fVar125;
  auVar24 = vfmadd231ps_fma(auVar168,auVar215,auVar195);
  auVar13 = vfmadd231ps_fma(auVar22,auVar215,auVar154);
  auVar14 = vfmadd231ps_fma(auVar133,auVar215,auVar124);
  auVar15 = vfmadd231ps_fma(ZEXT1632(auVar24),auVar210,auVar135);
  auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar210,auVar152);
  local_2e0._8_4_ = 0x7fffffff;
  local_2e0._0_8_ = 0x7fffffff7fffffff;
  local_2e0._12_4_ = 0x7fffffff;
  local_2e0._16_4_ = 0x7fffffff;
  local_2e0._20_4_ = 0x7fffffff;
  local_2e0._24_4_ = 0x7fffffff;
  local_2e0._28_4_ = 0x7fffffff;
  auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar210,auVar151);
  auVar135 = vandps_avx(ZEXT1632(auVar12),local_2e0);
  auVar161._8_4_ = 0x219392ef;
  auVar161._0_8_ = 0x219392ef219392ef;
  auVar161._12_4_ = 0x219392ef;
  auVar161._16_4_ = 0x219392ef;
  auVar161._20_4_ = 0x219392ef;
  auVar161._24_4_ = 0x219392ef;
  auVar161._28_4_ = 0x219392ef;
  auVar135 = vcmpps_avx(auVar135,auVar161,1);
  auVar195 = vblendvps_avx(ZEXT1632(auVar12),auVar161,auVar135);
  auVar135 = vandps_avx(ZEXT1632(auVar10),local_2e0);
  auVar135 = vcmpps_avx(auVar135,auVar161,1);
  auVar133 = vblendvps_avx(ZEXT1632(auVar10),auVar161,auVar135);
  auVar135 = vandps_avx(local_2e0,ZEXT1632(auVar11));
  auVar135 = vcmpps_avx(auVar135,auVar161,1);
  auVar152 = vrcpps_avx(auVar195);
  auVar135 = vblendvps_avx(ZEXT1632(auVar11),auVar161,auVar135);
  auVar186._8_4_ = 0x3f800000;
  auVar186._0_8_ = 0x3f8000003f800000;
  auVar186._12_4_ = 0x3f800000;
  auVar186._16_4_ = 0x3f800000;
  auVar186._20_4_ = 0x3f800000;
  auVar186._24_4_ = 0x3f800000;
  auVar186._28_4_ = 0x3f800000;
  auVar24 = vfnmadd213ps_fma(auVar195,auVar152,auVar186);
  auVar195 = vrcpps_avx(auVar133);
  auVar24 = vfmadd132ps_fma(ZEXT1632(auVar24),auVar152,auVar152);
  auVar152 = vrcpps_avx(auVar135);
  auVar10 = vfnmadd213ps_fma(auVar133,auVar195,auVar186);
  auVar10 = vfmadd132ps_fma(ZEXT1632(auVar10),auVar195,auVar195);
  auVar11 = vfnmadd213ps_fma(auVar135,auVar152,auVar186);
  auVar11 = vfmadd132ps_fma(ZEXT1632(auVar11),auVar152,auVar152);
  auVar135 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar107 * 7 + 6));
  auVar135 = vcvtdq2ps_avx(auVar135);
  auVar135 = vsubps_avx(auVar135,ZEXT1632(auVar15));
  auVar195 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar107 * 9 + 6));
  auVar152._4_4_ = auVar24._4_4_ * auVar135._4_4_;
  auVar152._0_4_ = auVar24._0_4_ * auVar135._0_4_;
  auVar152._8_4_ = auVar24._8_4_ * auVar135._8_4_;
  auVar152._12_4_ = auVar24._12_4_ * auVar135._12_4_;
  auVar152._16_4_ = auVar135._16_4_ * 0.0;
  auVar152._20_4_ = auVar135._20_4_ * 0.0;
  auVar152._24_4_ = auVar135._24_4_ * 0.0;
  auVar152._28_4_ = auVar135._28_4_;
  auVar135 = vcvtdq2ps_avx(auVar195);
  auVar135 = vsubps_avx(auVar135,ZEXT1632(auVar15));
  auVar154._4_4_ = auVar24._4_4_ * auVar135._4_4_;
  auVar154._0_4_ = auVar24._0_4_ * auVar135._0_4_;
  auVar154._8_4_ = auVar24._8_4_ * auVar135._8_4_;
  auVar154._12_4_ = auVar24._12_4_ * auVar135._12_4_;
  auVar154._16_4_ = auVar135._16_4_ * 0.0;
  auVar154._20_4_ = auVar135._20_4_ * 0.0;
  auVar154._24_4_ = auVar135._24_4_ * 0.0;
  auVar154._28_4_ = auVar135._28_4_;
  auVar135 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar107 * 0xe + 6));
  auVar135 = vcvtdq2ps_avx(auVar135);
  auVar135 = vsubps_avx(auVar135,ZEXT1632(auVar13));
  auVar127._1_3_ = 0;
  auVar127[0] = PVar18;
  auVar195 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + (ulong)(byte)PVar18 * 0x10 + 6));
  auVar120._4_4_ = auVar10._4_4_ * auVar135._4_4_;
  auVar120._0_4_ = auVar10._0_4_ * auVar135._0_4_;
  auVar120._8_4_ = auVar10._8_4_ * auVar135._8_4_;
  auVar120._12_4_ = auVar10._12_4_ * auVar135._12_4_;
  auVar120._16_4_ = auVar135._16_4_ * 0.0;
  auVar120._20_4_ = auVar135._20_4_ * 0.0;
  auVar120._24_4_ = auVar135._24_4_ * 0.0;
  auVar120._28_4_ = auVar135._28_4_;
  auVar135 = vcvtdq2ps_avx(auVar195);
  auVar135 = vsubps_avx(auVar135,ZEXT1632(auVar13));
  auVar151._4_4_ = auVar10._4_4_ * auVar135._4_4_;
  auVar151._0_4_ = auVar10._0_4_ * auVar135._0_4_;
  auVar151._8_4_ = auVar10._8_4_ * auVar135._8_4_;
  auVar151._12_4_ = auVar10._12_4_ * auVar135._12_4_;
  auVar151._16_4_ = auVar135._16_4_ * 0.0;
  auVar151._20_4_ = auVar135._20_4_ * 0.0;
  auVar151._24_4_ = auVar135._24_4_ * 0.0;
  auVar151._28_4_ = auVar135._28_4_;
  auVar135 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar107 * 0x15 + 6));
  auVar135 = vcvtdq2ps_avx(auVar135);
  auVar135 = vsubps_avx(auVar135,ZEXT1632(auVar14));
  auVar124._4_4_ = auVar135._4_4_ * auVar11._4_4_;
  auVar124._0_4_ = auVar135._0_4_ * auVar11._0_4_;
  auVar124._8_4_ = auVar135._8_4_ * auVar11._8_4_;
  auVar124._12_4_ = auVar135._12_4_ * auVar11._12_4_;
  auVar124._16_4_ = auVar135._16_4_ * 0.0;
  auVar124._20_4_ = auVar135._20_4_ * 0.0;
  auVar124._24_4_ = auVar135._24_4_ * 0.0;
  auVar124._28_4_ = auVar135._28_4_;
  auVar135 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar107 * 0x17 + 6));
  auVar135 = vcvtdq2ps_avx(auVar135);
  auVar135 = vsubps_avx(auVar135,ZEXT1632(auVar14));
  auVar189._4_4_ = auVar11._4_4_ * auVar135._4_4_;
  auVar189._0_4_ = auVar11._0_4_ * auVar135._0_4_;
  auVar189._8_4_ = auVar11._8_4_ * auVar135._8_4_;
  auVar189._12_4_ = auVar11._12_4_ * auVar135._12_4_;
  auVar189._16_4_ = auVar135._16_4_ * 0.0;
  auVar189._20_4_ = auVar135._20_4_ * 0.0;
  auVar189._24_4_ = auVar135._24_4_ * 0.0;
  auVar189._28_4_ = auVar135._28_4_;
  auVar135 = vpminsd_avx2(auVar152,auVar154);
  auVar195 = vpminsd_avx2(auVar120,auVar151);
  auVar135 = vmaxps_avx(auVar135,auVar195);
  auVar195 = vpminsd_avx2(auVar124,auVar189);
  uVar112 = *(undefined4 *)((long)&(ray->org).field_0 + 0xc);
  auVar187._4_4_ = uVar112;
  auVar187._0_4_ = uVar112;
  auVar187._8_4_ = uVar112;
  auVar187._12_4_ = uVar112;
  auVar187._16_4_ = uVar112;
  auVar187._20_4_ = uVar112;
  auVar187._24_4_ = uVar112;
  auVar187._28_4_ = uVar112;
  auVar192 = ZEXT3264(auVar187);
  auVar195 = vmaxps_avx(auVar195,auVar187);
  auVar135 = vmaxps_avx(auVar135,auVar195);
  local_80._4_4_ = auVar135._4_4_ * 0.99999964;
  local_80._0_4_ = auVar135._0_4_ * 0.99999964;
  local_80._8_4_ = auVar135._8_4_ * 0.99999964;
  local_80._12_4_ = auVar135._12_4_ * 0.99999964;
  local_80._16_4_ = auVar135._16_4_ * 0.99999964;
  local_80._20_4_ = auVar135._20_4_ * 0.99999964;
  local_80._24_4_ = auVar135._24_4_ * 0.99999964;
  local_80._28_4_ = 0x3f7ffffa;
  auVar135 = vpmaxsd_avx2(auVar152,auVar154);
  auVar195 = vpmaxsd_avx2(auVar120,auVar151);
  auVar135 = vminps_avx(auVar135,auVar195);
  auVar195 = vpmaxsd_avx2(auVar124,auVar189);
  fVar143 = ray->tfar;
  auVar149._4_4_ = fVar143;
  auVar149._0_4_ = fVar143;
  auVar149._8_4_ = fVar143;
  auVar149._12_4_ = fVar143;
  auVar149._16_4_ = fVar143;
  auVar149._20_4_ = fVar143;
  auVar149._24_4_ = fVar143;
  auVar149._28_4_ = fVar143;
  auVar195 = vminps_avx(auVar195,auVar149);
  auVar135 = vminps_avx(auVar135,auVar195);
  auVar195._4_4_ = auVar135._4_4_ * 1.0000004;
  auVar195._0_4_ = auVar135._0_4_ * 1.0000004;
  auVar195._8_4_ = auVar135._8_4_ * 1.0000004;
  auVar195._12_4_ = auVar135._12_4_ * 1.0000004;
  auVar195._16_4_ = auVar135._16_4_ * 1.0000004;
  auVar195._20_4_ = auVar135._20_4_ * 1.0000004;
  auVar195._24_4_ = auVar135._24_4_ * 1.0000004;
  auVar195._28_4_ = auVar135._28_4_;
  auVar127[4] = PVar18;
  auVar127._5_3_ = 0;
  auVar127[8] = PVar18;
  auVar127._9_3_ = 0;
  auVar127[0xc] = PVar18;
  auVar127._13_3_ = 0;
  auVar127[0x10] = PVar18;
  auVar127._17_3_ = 0;
  auVar127[0x14] = PVar18;
  auVar127._21_3_ = 0;
  auVar127[0x18] = PVar18;
  auVar127._25_3_ = 0;
  auVar127[0x1c] = PVar18;
  auVar127._29_3_ = 0;
  auVar135 = vcmpps_avx(local_80,auVar195,2);
  auVar195 = vpcmpgtd_avx2(auVar127,_DAT_01fb4ba0);
  auVar135 = vandps_avx(auVar135,auVar195);
  local_4a0 = mm_lookupmask_ps._16_8_;
  uStack_498 = mm_lookupmask_ps._24_8_;
  uStack_490 = mm_lookupmask_ps._16_8_;
  uStack_488 = mm_lookupmask_ps._24_8_;
  uVar112 = vmovmskps_avx(auVar135);
  local_4a8 = CONCAT44((int)((ulong)unaff_R14 >> 0x20),uVar112);
  local_7a8 = prim;
  while (auVar135 = local_3e0, local_4a8 != 0) {
    auVar133 = auVar203._0_32_;
    auVar195 = auVar198._0_32_;
    local_6e0 = auVar192._0_32_;
    local_6a0 = auVar194._0_32_;
    lVar110 = 0;
    for (uVar107 = local_4a8; (uVar107 & 1) == 0; uVar107 = uVar107 >> 1 | 0x8000000000000000) {
      lVar110 = lVar110 + 1;
    }
    local_730 = (ulong)*(uint *)(local_7a8 + 2);
    pGVar20 = (context->scene->geometries).items[*(uint *)(local_7a8 + 2)].ptr;
    local_4c8 = (ulong)*(uint *)(local_7a8 + lVar110 * 4 + 6);
    uVar107 = (ulong)*(uint *)(*(long *)&pGVar20->field_0x58 +
                              pGVar20[1].super_RefCount.refCounter.
                              super___atomic_base<unsigned_long>._M_i *
                              (ulong)*(uint *)(local_7a8 + lVar110 * 4 + 6));
    p_Var21 = pGVar20[1].intersectionFilterN;
    lVar110 = *(long *)&pGVar20[1].time_range.upper;
    pauVar1 = (undefined1 (*) [16])(lVar110 + (long)p_Var21 * uVar107);
    local_600 = *(undefined8 *)*pauVar1;
    uStack_5f8 = *(undefined8 *)(*pauVar1 + 8);
    pauVar2 = (undefined1 (*) [16])(lVar110 + (uVar107 + 1) * (long)p_Var21);
    local_610 = *(undefined8 *)*pauVar2;
    uStack_608 = *(undefined8 *)(*pauVar2 + 8);
    pauVar3 = (undefined1 (*) [16])(lVar110 + (uVar107 + 2) * (long)p_Var21);
    local_620 = *(undefined8 *)*pauVar3;
    uStack_618 = *(undefined8 *)(*pauVar3 + 8);
    uVar113 = local_4a8 - 1 & local_4a8;
    pauVar4 = (undefined1 (*) [12])(lVar110 + (uVar107 + 3) * (long)p_Var21);
    local_4c0 = (float)*(undefined8 *)*pauVar4;
    fStack_4bc = (float)((ulong)*(undefined8 *)*pauVar4 >> 0x20);
    fStack_4b8 = (float)*(undefined8 *)(*pauVar4 + 8);
    fStack_4b4 = (float)((ulong)*(undefined8 *)(*pauVar4 + 8) >> 0x20);
    if (uVar113 != 0) {
      uVar109 = uVar113 - 1 & uVar113;
      for (uVar107 = uVar113; (uVar107 & 1) == 0; uVar107 = uVar107 >> 1 | 0x8000000000000000) {
      }
      if (uVar109 != 0) {
        for (; (uVar109 & 1) == 0; uVar109 = uVar109 >> 1 | 0x8000000000000000) {
        }
      }
    }
    iVar19 = (int)pGVar20[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
    aVar7 = (ray->org).field_0;
    auVar10 = vsubps_avx(*pauVar1,(undefined1  [16])aVar7);
    uVar112 = auVar10._0_4_;
    auVar144._4_4_ = uVar112;
    auVar144._0_4_ = uVar112;
    auVar144._8_4_ = uVar112;
    auVar144._12_4_ = uVar112;
    auVar24 = vshufps_avx(auVar10,auVar10,0x55);
    auVar10 = vshufps_avx(auVar10,auVar10,0xaa);
    aVar8 = (local_728->ray_space).vx.field_0;
    aVar9 = (local_728->ray_space).vy.field_0;
    fVar143 = (local_728->ray_space).vz.field_0.m128[0];
    fVar125 = (local_728->ray_space).vz.field_0.m128[1];
    fVar138 = (local_728->ray_space).vz.field_0.m128[2];
    fVar139 = (local_728->ray_space).vz.field_0.m128[3];
    auVar164._0_4_ = auVar10._0_4_ * fVar143;
    auVar164._4_4_ = auVar10._4_4_ * fVar125;
    auVar164._8_4_ = auVar10._8_4_ * fVar138;
    auVar164._12_4_ = auVar10._12_4_ * fVar139;
    auVar24 = vfmadd231ps_fma(auVar164,(undefined1  [16])aVar9,auVar24);
    auVar14 = vfmadd231ps_fma(auVar24,(undefined1  [16])aVar8,auVar144);
    auVar24 = vblendps_avx(auVar14,*pauVar1,8);
    auVar11 = vsubps_avx(*pauVar2,(undefined1  [16])aVar7);
    uVar112 = auVar11._0_4_;
    auVar165._4_4_ = uVar112;
    auVar165._0_4_ = uVar112;
    auVar165._8_4_ = uVar112;
    auVar165._12_4_ = uVar112;
    auVar10 = vshufps_avx(auVar11,auVar11,0x55);
    auVar11 = vshufps_avx(auVar11,auVar11,0xaa);
    auVar193._0_4_ = auVar11._0_4_ * fVar143;
    auVar193._4_4_ = auVar11._4_4_ * fVar125;
    auVar193._8_4_ = auVar11._8_4_ * fVar138;
    auVar193._12_4_ = auVar11._12_4_ * fVar139;
    auVar10 = vfmadd231ps_fma(auVar193,(undefined1  [16])aVar9,auVar10);
    auVar15 = vfmadd231ps_fma(auVar10,(undefined1  [16])aVar8,auVar165);
    auVar10 = vblendps_avx(auVar15,*pauVar2,8);
    auVar12 = vsubps_avx(*pauVar3,(undefined1  [16])aVar7);
    uVar112 = auVar12._0_4_;
    auVar172._4_4_ = uVar112;
    auVar172._0_4_ = uVar112;
    auVar172._8_4_ = uVar112;
    auVar172._12_4_ = uVar112;
    auVar11 = vshufps_avx(auVar12,auVar12,0x55);
    auVar12 = vshufps_avx(auVar12,auVar12,0xaa);
    auVar199._0_4_ = auVar12._0_4_ * fVar143;
    auVar199._4_4_ = auVar12._4_4_ * fVar125;
    auVar199._8_4_ = auVar12._8_4_ * fVar138;
    auVar199._12_4_ = auVar12._12_4_ * fVar139;
    auVar11 = vfmadd231ps_fma(auVar199,(undefined1  [16])aVar9,auVar11);
    auVar16 = vfmadd231ps_fma(auVar11,(undefined1  [16])aVar8,auVar172);
    auVar11 = vblendps_avx(auVar16,*pauVar3,8);
    auVar26._12_4_ = fStack_4b4;
    auVar26._0_12_ = *pauVar4;
    auVar13 = vsubps_avx(auVar26,(undefined1  [16])aVar7);
    uVar112 = auVar13._0_4_;
    auVar180._4_4_ = uVar112;
    auVar180._0_4_ = uVar112;
    auVar180._8_4_ = uVar112;
    auVar180._12_4_ = uVar112;
    auVar12 = vshufps_avx(auVar13,auVar13,0x55);
    auVar13 = vshufps_avx(auVar13,auVar13,0xaa);
    auVar206._0_4_ = auVar13._0_4_ * fVar143;
    auVar206._4_4_ = auVar13._4_4_ * fVar125;
    auVar206._8_4_ = auVar13._8_4_ * fVar138;
    auVar206._12_4_ = auVar13._12_4_ * fVar139;
    auVar12 = vfmadd231ps_fma(auVar206,(undefined1  [16])aVar9,auVar12);
    auVar17 = vfmadd231ps_fma(auVar12,(undefined1  [16])aVar8,auVar180);
    auVar12 = vblendps_avx(auVar17,auVar26,8);
    auVar126._8_4_ = 0x7fffffff;
    auVar126._0_8_ = 0x7fffffff7fffffff;
    auVar126._12_4_ = 0x7fffffff;
    auVar24 = vandps_avx(auVar24,auVar126);
    auVar10 = vandps_avx(auVar10,auVar126);
    auVar13 = vmaxps_avx(auVar24,auVar10);
    auVar24 = vandps_avx(auVar11,auVar126);
    auVar10 = vandps_avx(auVar12,auVar126);
    auVar24 = vmaxps_avx(auVar24,auVar10);
    auVar24 = vmaxps_avx(auVar13,auVar24);
    auVar10 = vmovshdup_avx(auVar24);
    auVar10 = vmaxss_avx(auVar10,auVar24);
    auVar24 = vshufpd_avx(auVar24,auVar24,1);
    auVar24 = vmaxss_avx(auVar24,auVar10);
    local_7b0 = (long)iVar19;
    lVar110 = local_7b0 * 0x44;
    auVar10 = vmovshdup_avx(auVar14);
    uVar114 = auVar10._0_8_;
    local_480._8_8_ = uVar114;
    local_480._0_8_ = uVar114;
    local_480._16_8_ = uVar114;
    local_480._24_8_ = uVar114;
    auVar10 = vmovshdup_avx(auVar15);
    uVar114 = auVar10._0_8_;
    local_660._8_8_ = uVar114;
    local_660._0_8_ = uVar114;
    local_660._16_8_ = uVar114;
    local_660._24_8_ = uVar114;
    auVar152 = *(undefined1 (*) [32])(bezier_basis0 + lVar110 + 0x908);
    local_6c0._0_4_ = auVar16._0_4_;
    local_6c0._4_4_ = local_6c0._0_4_;
    local_6c0._8_4_ = local_6c0._0_4_;
    local_6c0._12_4_ = local_6c0._0_4_;
    local_6c0._16_4_ = local_6c0._0_4_;
    local_6c0._20_4_ = local_6c0._0_4_;
    local_6c0._24_4_ = local_6c0._0_4_;
    local_6c0._28_4_ = local_6c0._0_4_;
    auVar10 = vmovshdup_avx(auVar16);
    uVar114 = auVar10._0_8_;
    local_5c0._8_8_ = uVar114;
    local_5c0._0_8_ = uVar114;
    local_5c0._16_8_ = uVar114;
    local_5c0._24_8_ = uVar114;
    fVar139 = *(float *)*(undefined1 (*) [28])(bezier_basis0 + lVar110 + 0xd8c);
    fVar207 = *(float *)(bezier_basis0 + lVar110 + 0xd90);
    fVar84 = *(float *)(bezier_basis0 + lVar110 + 0xd94);
    fVar85 = *(float *)(bezier_basis0 + lVar110 + 0xd98);
    fVar86 = *(float *)(bezier_basis0 + lVar110 + 0xd9c);
    fVar87 = *(float *)(bezier_basis0 + lVar110 + 0xda0);
    fVar88 = *(float *)(bezier_basis0 + lVar110 + 0xda4);
    auVar104 = *(undefined1 (*) [28])(bezier_basis0 + lVar110 + 0xd8c);
    local_580 = auVar17._0_4_;
    auVar10 = vmovshdup_avx(auVar17);
    auVar198._0_4_ = fVar139 * local_580;
    auVar198._4_4_ = fVar207 * local_580;
    auVar198._8_4_ = fVar84 * local_580;
    auVar198._12_4_ = fVar85 * local_580;
    auVar198._16_4_ = fVar86 * local_580;
    auVar198._20_4_ = fVar87 * local_580;
    auVar198._28_36_ = auVar213._28_36_;
    auVar198._24_4_ = fVar88 * local_580;
    local_5a0 = auVar10._0_4_;
    auVar116._0_4_ = fVar139 * local_5a0;
    fStack_59c = auVar10._4_4_;
    auVar116._4_4_ = fVar207 * fStack_59c;
    auVar116._8_4_ = fVar84 * local_5a0;
    auVar116._12_4_ = fVar85 * fStack_59c;
    auVar116._16_4_ = fVar86 * local_5a0;
    auVar116._20_4_ = fVar87 * fStack_59c;
    auVar116._24_4_ = fVar88 * local_5a0;
    auVar116._28_4_ = 0;
    auVar11 = vfmadd231ps_fma(auVar198._0_32_,auVar152,local_6c0);
    auVar12 = vfmadd231ps_fma(auVar116,auVar152,local_5c0);
    auVar154 = *(undefined1 (*) [32])(bezier_basis0 + lVar110 + 0x484);
    uVar112 = auVar15._0_4_;
    local_640._4_4_ = uVar112;
    local_640._0_4_ = uVar112;
    local_640._8_4_ = uVar112;
    local_640._12_4_ = uVar112;
    local_640._16_4_ = uVar112;
    local_640._20_4_ = uVar112;
    local_640._24_4_ = uVar112;
    local_640._28_4_ = uVar112;
    auVar11 = vfmadd231ps_fma(ZEXT1632(auVar11),auVar154,local_640);
    auVar12 = vfmadd231ps_fma(ZEXT1632(auVar12),auVar154,local_660);
    auVar120 = *(undefined1 (*) [32])(bezier_basis0 + lVar110);
    uVar112 = auVar14._0_4_;
    local_520._4_4_ = uVar112;
    local_520._0_4_ = uVar112;
    local_520._8_4_ = uVar112;
    local_520._12_4_ = uVar112;
    local_520._16_4_ = uVar112;
    local_520._20_4_ = uVar112;
    local_520._24_4_ = uVar112;
    local_520._28_4_ = uVar112;
    auVar11 = vfmadd231ps_fma(ZEXT1632(auVar11),auVar120,local_520);
    auVar12 = vfmadd231ps_fma(ZEXT1632(auVar12),auVar120,local_480);
    auVar151 = *(undefined1 (*) [32])(bezier_basis1 + lVar110 + 0x908);
    fVar89 = *(float *)(bezier_basis1 + lVar110 + 0xd8c);
    fVar90 = *(float *)(bezier_basis1 + lVar110 + 0xd90);
    fVar91 = *(float *)(bezier_basis1 + lVar110 + 0xd94);
    fVar92 = *(float *)(bezier_basis1 + lVar110 + 0xd98);
    fVar93 = *(float *)(bezier_basis1 + lVar110 + 0xd9c);
    fVar94 = *(float *)(bezier_basis1 + lVar110 + 0xda0);
    fVar95 = *(float *)(bezier_basis1 + lVar110 + 0xda4);
    fStack_57c = local_580;
    fStack_578 = local_580;
    fStack_574 = local_580;
    fStack_570 = local_580;
    fStack_56c = local_580;
    fStack_568 = local_580;
    fStack_564 = local_580;
    auVar28._4_4_ = fVar90 * local_580;
    auVar28._0_4_ = fVar89 * local_580;
    auVar28._8_4_ = fVar91 * local_580;
    auVar28._12_4_ = fVar92 * local_580;
    auVar28._16_4_ = fVar93 * local_580;
    auVar28._20_4_ = fVar94 * local_580;
    auVar28._24_4_ = fVar95 * local_580;
    auVar28._28_4_ = local_580;
    auVar13 = vfmadd231ps_fma(auVar28,auVar151,local_6c0);
    auVar29._4_4_ = fVar90 * fStack_59c;
    auVar29._0_4_ = fVar89 * local_5a0;
    auVar29._8_4_ = fVar91 * local_5a0;
    auVar29._12_4_ = fVar92 * fStack_59c;
    auVar29._16_4_ = fVar93 * local_5a0;
    auVar29._20_4_ = fVar94 * fStack_59c;
    auVar29._24_4_ = fVar95 * local_5a0;
    auVar29._28_4_ = fStack_59c;
    auVar115 = vfmadd231ps_fma(auVar29,auVar151,local_5c0);
    auVar124 = *(undefined1 (*) [32])(bezier_basis1 + lVar110 + 0x484);
    auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar124,local_640);
    auVar115 = vfmadd231ps_fma(ZEXT1632(auVar115),auVar124,local_660);
    auVar189 = *(undefined1 (*) [32])(bezier_basis1 + lVar110);
    auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar189,local_520);
    auVar115 = vfmadd231ps_fma(ZEXT1632(auVar115),auVar189,local_480);
    local_320 = ZEXT1632(auVar13);
    local_360 = ZEXT1632(auVar11);
    auVar127 = vsubps_avx(local_320,local_360);
    local_340 = ZEXT1632(auVar115);
    auVar117 = ZEXT1632(auVar12);
    auVar149 = vsubps_avx(local_340,auVar117);
    auVar118._0_4_ = auVar12._0_4_ * auVar127._0_4_;
    auVar118._4_4_ = auVar12._4_4_ * auVar127._4_4_;
    auVar118._8_4_ = auVar12._8_4_ * auVar127._8_4_;
    auVar118._12_4_ = auVar12._12_4_ * auVar127._12_4_;
    auVar118._16_4_ = auVar127._16_4_ * 0.0;
    auVar118._20_4_ = auVar127._20_4_ * 0.0;
    auVar118._24_4_ = auVar127._24_4_ * 0.0;
    auVar118._28_4_ = 0;
    fVar143 = auVar149._0_4_;
    auVar128._0_4_ = auVar11._0_4_ * fVar143;
    fVar138 = auVar149._4_4_;
    auVar128._4_4_ = auVar11._4_4_ * fVar138;
    fVar140 = auVar149._8_4_;
    auVar128._8_4_ = auVar11._8_4_ * fVar140;
    fVar141 = auVar149._12_4_;
    auVar128._12_4_ = auVar11._12_4_ * fVar141;
    fVar142 = auVar149._16_4_;
    auVar128._16_4_ = fVar142 * 0.0;
    fVar23 = auVar149._20_4_;
    auVar128._20_4_ = fVar23 * 0.0;
    fVar205 = auVar149._24_4_;
    auVar128._24_4_ = fVar205 * 0.0;
    auVar128._28_4_ = 0;
    auVar161 = vsubps_avx(auVar118,auVar128);
    auVar11 = vpermilps_avx(*pauVar1,0xff);
    uVar114 = auVar11._0_8_;
    local_a0._8_8_ = uVar114;
    local_a0._0_8_ = uVar114;
    local_a0._16_8_ = uVar114;
    local_a0._24_8_ = uVar114;
    auVar12 = vpermilps_avx(*pauVar2,0xff);
    uVar114 = auVar12._0_8_;
    local_c0._8_8_ = uVar114;
    local_c0._0_8_ = uVar114;
    local_c0._16_8_ = uVar114;
    local_c0._24_8_ = uVar114;
    auVar12 = vpermilps_avx(*pauVar3,0xff);
    uVar114 = auVar12._0_8_;
    local_e0._8_8_ = uVar114;
    local_e0._0_8_ = uVar114;
    local_e0._16_8_ = uVar114;
    local_e0._24_8_ = uVar114;
    auVar27._12_4_ = fStack_4b4;
    auVar27._0_12_ = *pauVar4;
    auVar12 = vpermilps_avx(auVar27,0xff);
    local_100 = auVar12._0_8_;
    fVar125 = auVar12._0_4_;
    auVar173._0_4_ = fVar139 * fVar125;
    fVar139 = auVar12._4_4_;
    auVar173._4_4_ = fVar207 * fVar139;
    auVar173._8_4_ = fVar84 * fVar125;
    auVar173._12_4_ = fVar85 * fVar139;
    auVar173._16_4_ = fVar86 * fVar125;
    auVar173._20_4_ = fVar87 * fVar139;
    auVar173._24_4_ = fVar88 * fVar125;
    auVar173._28_4_ = 0;
    auVar12 = vfmadd231ps_fma(auVar173,local_e0,auVar152);
    auVar12 = vfmadd231ps_fma(ZEXT1632(auVar12),auVar154,local_c0);
    auVar12 = vfmadd231ps_fma(ZEXT1632(auVar12),auVar120,local_a0);
    uStack_f8 = local_100;
    uStack_f0 = local_100;
    uStack_e8 = local_100;
    auVar30._4_4_ = fVar90 * fVar139;
    auVar30._0_4_ = fVar89 * fVar125;
    auVar30._8_4_ = fVar91 * fVar125;
    auVar30._12_4_ = fVar92 * fVar139;
    auVar30._16_4_ = fVar93 * fVar125;
    auVar30._20_4_ = fVar94 * fVar139;
    auVar30._24_4_ = fVar95 * fVar125;
    auVar30._28_4_ = auVar120._28_4_;
    auVar13 = vfmadd231ps_fma(auVar30,auVar151,local_e0);
    auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar124,local_c0);
    auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar189,local_a0);
    auVar31._4_4_ = fVar138 * fVar138;
    auVar31._0_4_ = fVar143 * fVar143;
    auVar31._8_4_ = fVar140 * fVar140;
    auVar31._12_4_ = fVar141 * fVar141;
    auVar31._16_4_ = fVar142 * fVar142;
    auVar31._20_4_ = fVar23 * fVar23;
    auVar31._24_4_ = fVar205 * fVar205;
    auVar31._28_4_ = auVar11._4_4_;
    auVar11 = vfmadd231ps_fma(auVar31,auVar127,auVar127);
    auVar22 = vmaxps_avx(ZEXT1632(auVar12),ZEXT1632(auVar13));
    auVar32._4_4_ = auVar11._4_4_ * auVar22._4_4_ * auVar22._4_4_;
    auVar32._0_4_ = auVar11._0_4_ * auVar22._0_4_ * auVar22._0_4_;
    auVar32._8_4_ = auVar11._8_4_ * auVar22._8_4_ * auVar22._8_4_;
    auVar32._12_4_ = auVar11._12_4_ * auVar22._12_4_ * auVar22._12_4_;
    auVar32._16_4_ = auVar22._16_4_ * auVar22._16_4_ * 0.0;
    auVar32._20_4_ = auVar22._20_4_ * auVar22._20_4_ * 0.0;
    auVar32._24_4_ = auVar22._24_4_ * auVar22._24_4_ * 0.0;
    auVar32._28_4_ = auVar22._28_4_;
    auVar33._4_4_ = auVar161._4_4_ * auVar161._4_4_;
    auVar33._0_4_ = auVar161._0_4_ * auVar161._0_4_;
    auVar33._8_4_ = auVar161._8_4_ * auVar161._8_4_;
    auVar33._12_4_ = auVar161._12_4_ * auVar161._12_4_;
    auVar33._16_4_ = auVar161._16_4_ * auVar161._16_4_;
    auVar33._20_4_ = auVar161._20_4_ * auVar161._20_4_;
    auVar33._24_4_ = auVar161._24_4_ * auVar161._24_4_;
    auVar33._28_4_ = auVar161._28_4_;
    auVar22 = vcmpps_avx(auVar33,auVar32,2);
    fVar143 = auVar24._0_4_ * 4.7683716e-07;
    auVar129._0_4_ = (float)iVar19;
    local_3e0._4_12_ = auVar17._4_12_;
    local_3e0._0_4_ = auVar129._0_4_;
    local_3e0._16_16_ = auVar135._16_16_;
    auVar129._4_4_ = auVar129._0_4_;
    auVar129._8_4_ = auVar129._0_4_;
    auVar129._12_4_ = auVar129._0_4_;
    auVar129._16_4_ = auVar129._0_4_;
    auVar129._20_4_ = auVar129._0_4_;
    auVar129._24_4_ = auVar129._0_4_;
    auVar129._28_4_ = auVar129._0_4_;
    auVar135 = vcmpps_avx(_DAT_01f7b060,auVar129,1);
    auVar24 = vpermilps_avx(auVar14,0xaa);
    uVar114 = auVar24._0_8_;
    local_400._8_8_ = uVar114;
    local_400._0_8_ = uVar114;
    local_400._16_8_ = uVar114;
    local_400._24_8_ = uVar114;
    auVar24 = vpermilps_avx(auVar15,0xaa);
    uVar114 = auVar24._0_8_;
    local_120._8_8_ = uVar114;
    local_120._0_8_ = uVar114;
    local_120._16_8_ = uVar114;
    local_120._24_8_ = uVar114;
    auVar24 = vpermilps_avx(auVar16,0xaa);
    uVar114 = auVar24._0_8_;
    local_300._8_8_ = uVar114;
    local_300._0_8_ = uVar114;
    local_300._16_8_ = uVar114;
    local_300._24_8_ = uVar114;
    auVar24 = vshufps_avx(auVar17,auVar17,0xaa);
    uVar114 = auVar24._0_8_;
    auVar161 = auVar135 & auVar22;
    local_540._0_16_ = vpermilps_avx((undefined1  [16])aVar7,0xff);
    auVar168 = local_540;
    local_760._0_16_ = ZEXT416((uint)fVar143);
    uVar208 = uVar114;
    uStack_550 = uVar114;
    uStack_548 = uVar114;
    fStack_598 = local_5a0;
    fStack_594 = fStack_59c;
    fStack_590 = local_5a0;
    fStack_58c = fStack_59c;
    fStack_588 = local_5a0;
    fStack_584 = fStack_59c;
    local_540 = auVar168;
    if ((((((((auVar161 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar161 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar161 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar161 >> 0x7f,0) == '\0') &&
          (auVar161 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar161 >> 0xbf,0) == '\0') &&
        (auVar161 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar161[0x1f])
    {
      auVar198 = ZEXT3264(auVar195);
      auVar203 = ZEXT3264(auVar133);
LAB_013759b4:
      auVar213 = ZEXT3264(local_6c0);
      auVar194 = ZEXT3264(local_6a0);
      auVar192 = ZEXT3264(local_6e0);
      auVar216 = ZEXT3264(local_5c0);
      bVar111 = 0;
      auVar178 = ZEXT3264(CONCAT428(local_580,
                                    CONCAT424(local_580,
                                              CONCAT420(local_580,
                                                        CONCAT416(local_580,
                                                                  CONCAT412(local_580,
                                                                            CONCAT48(local_580,
                                                                                     CONCAT44(
                                                  local_580,local_580))))))));
      auVar181 = ZEXT3264(CONCAT428(fStack_59c,
                                    CONCAT424(local_5a0,
                                              CONCAT420(fStack_59c,
                                                        CONCAT416(local_5a0,
                                                                  CONCAT412(fStack_59c,
                                                                            CONCAT48(local_5a0,
                                                                                     auVar10._0_8_))
                                                                 )))));
      auVar185 = ZEXT3264(local_640);
      auVar160 = ZEXT3264(local_520);
    }
    else {
      local_380 = vandps_avx(auVar135,auVar22);
      fVar205 = auVar24._0_4_;
      fVar207 = auVar24._4_4_;
      auVar135._4_4_ = fVar207 * fVar90;
      auVar135._0_4_ = fVar205 * fVar89;
      auVar135._8_4_ = fVar205 * fVar91;
      auVar135._12_4_ = fVar207 * fVar92;
      auVar135._16_4_ = fVar205 * fVar93;
      auVar135._20_4_ = fVar207 * fVar94;
      auVar135._24_4_ = fVar205 * fVar95;
      auVar135._28_4_ = local_380._28_4_;
      auVar24 = vfmadd213ps_fma(auVar151,local_300,auVar135);
      auVar24 = vfmadd213ps_fma(auVar124,local_120,ZEXT1632(auVar24));
      auVar24 = vfmadd213ps_fma(auVar189,local_400,ZEXT1632(auVar24));
      local_460._0_4_ = auVar104._0_4_;
      local_460._4_4_ = auVar104._4_4_;
      fStack_458 = auVar104._8_4_;
      fStack_454 = auVar104._12_4_;
      fStack_450 = auVar104._16_4_;
      fStack_44c = auVar104._20_4_;
      fStack_448 = auVar104._24_4_;
      auVar119._0_4_ = fVar205 * (float)local_460._0_4_;
      auVar119._4_4_ = fVar207 * (float)local_460._4_4_;
      auVar119._8_4_ = fVar205 * fStack_458;
      auVar119._12_4_ = fVar207 * fStack_454;
      auVar119._16_4_ = fVar205 * fStack_450;
      auVar119._20_4_ = fVar207 * fStack_44c;
      auVar119._24_4_ = fVar205 * fStack_448;
      auVar119._28_4_ = 0;
      auVar11 = vfmadd213ps_fma(auVar152,local_300,auVar119);
      auVar11 = vfmadd213ps_fma(auVar154,local_120,ZEXT1632(auVar11));
      auVar135 = *(undefined1 (*) [32])(bezier_basis0 + lVar110 + 0x1210);
      auVar152 = *(undefined1 (*) [32])(bezier_basis0 + lVar110 + 0x1694);
      auVar154 = *(undefined1 (*) [32])(bezier_basis0 + lVar110 + 0x1b18);
      fVar125 = *(float *)(bezier_basis0 + lVar110 + 0x1f9c);
      fVar138 = *(float *)(bezier_basis0 + lVar110 + 0x1fa0);
      fVar139 = *(float *)(bezier_basis0 + lVar110 + 0x1fa4);
      fVar140 = *(float *)(bezier_basis0 + lVar110 + 0x1fa8);
      fVar141 = *(float *)(bezier_basis0 + lVar110 + 0x1fac);
      fVar142 = *(float *)(bezier_basis0 + lVar110 + 0x1fb0);
      fVar23 = *(float *)(bezier_basis0 + lVar110 + 0x1fb4);
      auVar150._0_4_ = local_580 * fVar125;
      auVar150._4_4_ = local_580 * fVar138;
      auVar150._8_4_ = local_580 * fVar139;
      auVar150._12_4_ = local_580 * fVar140;
      auVar150._16_4_ = local_580 * fVar141;
      auVar150._20_4_ = local_580 * fVar142;
      auVar150._24_4_ = local_580 * fVar23;
      auVar150._28_4_ = 0;
      _local_460 = auVar127;
      auVar34._4_4_ = fVar138 * fStack_59c;
      auVar34._0_4_ = fVar125 * local_5a0;
      auVar34._8_4_ = fVar139 * local_5a0;
      auVar34._12_4_ = fVar140 * fStack_59c;
      auVar34._16_4_ = fVar141 * local_5a0;
      auVar34._20_4_ = fVar142 * fStack_59c;
      auVar34._24_4_ = fVar23 * local_5a0;
      auVar34._28_4_ = auVar127._28_4_;
      auVar35._4_4_ = fVar207 * fVar138;
      auVar35._0_4_ = fVar205 * fVar125;
      auVar35._8_4_ = fVar205 * fVar139;
      auVar35._12_4_ = fVar207 * fVar140;
      auVar35._16_4_ = fVar205 * fVar141;
      auVar35._20_4_ = fVar207 * fVar142;
      auVar35._24_4_ = fVar205 * fVar23;
      auVar35._28_4_ = *(undefined4 *)(bezier_basis0 + lVar110 + 0x1fb8);
      auVar14 = vfmadd231ps_fma(auVar150,auVar154,local_6c0);
      uStack_558 = uVar114;
      local_560 = uVar114;
      auVar15 = vfmadd231ps_fma(auVar34,auVar154,local_5c0);
      auVar16 = vfmadd231ps_fma(auVar35,local_300,auVar154);
      auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar152,local_640);
      auVar15 = vfmadd231ps_fma(ZEXT1632(auVar15),auVar152,local_660);
      auVar16 = vfmadd231ps_fma(ZEXT1632(auVar16),local_120,auVar152);
      auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar135,local_520);
      auVar15 = vfmadd231ps_fma(ZEXT1632(auVar15),auVar135,local_480);
      auVar16 = vfmadd231ps_fma(ZEXT1632(auVar16),local_400,auVar135);
      fVar125 = *(float *)(bezier_basis1 + lVar110 + 0x1f9c);
      fVar138 = *(float *)(bezier_basis1 + lVar110 + 0x1fa0);
      fVar139 = *(float *)(bezier_basis1 + lVar110 + 0x1fa4);
      fVar140 = *(float *)(bezier_basis1 + lVar110 + 0x1fa8);
      fVar141 = *(float *)(bezier_basis1 + lVar110 + 0x1fac);
      fVar142 = *(float *)(bezier_basis1 + lVar110 + 0x1fb0);
      fVar23 = *(float *)(bezier_basis1 + lVar110 + 0x1fb4);
      auVar36._4_4_ = local_580 * fVar138;
      auVar36._0_4_ = local_580 * fVar125;
      auVar36._8_4_ = local_580 * fVar139;
      auVar36._12_4_ = local_580 * fVar140;
      auVar36._16_4_ = local_580 * fVar141;
      auVar36._20_4_ = local_580 * fVar142;
      auVar36._24_4_ = local_580 * fVar23;
      auVar36._28_4_ = auVar154._28_4_;
      auVar37._4_4_ = fStack_59c * fVar138;
      auVar37._0_4_ = local_5a0 * fVar125;
      auVar37._8_4_ = local_5a0 * fVar139;
      auVar37._12_4_ = fStack_59c * fVar140;
      auVar37._16_4_ = local_5a0 * fVar141;
      auVar37._20_4_ = fStack_59c * fVar142;
      auVar37._24_4_ = local_5a0 * fVar23;
      auVar37._28_4_ = local_580;
      auVar38._4_4_ = fVar138 * fVar207;
      auVar38._0_4_ = fVar125 * fVar205;
      auVar38._8_4_ = fVar139 * fVar205;
      auVar38._12_4_ = fVar140 * fVar207;
      auVar38._16_4_ = fVar141 * fVar205;
      auVar38._20_4_ = fVar142 * fVar207;
      auVar38._24_4_ = fVar23 * fVar205;
      auVar38._28_4_ = *(undefined4 *)(bezier_basis1 + lVar110 + 0x1fb8);
      auVar135 = *(undefined1 (*) [32])(bezier_basis1 + lVar110 + 0x1b18);
      auVar17 = vfmadd231ps_fma(auVar36,auVar135,local_6c0);
      auVar115 = vfmadd231ps_fma(auVar37,auVar135,local_5c0);
      auVar163 = vfmadd231ps_fma(auVar38,local_300,auVar135);
      auVar135 = *(undefined1 (*) [32])(bezier_basis1 + lVar110 + 0x1694);
      auVar17 = vfmadd231ps_fma(ZEXT1632(auVar17),auVar135,local_640);
      auVar115 = vfmadd231ps_fma(ZEXT1632(auVar115),auVar135,local_660);
      auVar163 = vfmadd231ps_fma(ZEXT1632(auVar163),local_120,auVar135);
      auVar135 = *(undefined1 (*) [32])(bezier_basis1 + lVar110 + 0x1210);
      auVar17 = vfmadd231ps_fma(ZEXT1632(auVar17),auVar135,local_520);
      auVar115 = vfmadd231ps_fma(ZEXT1632(auVar115),auVar135,local_480);
      auVar163 = vfmadd231ps_fma(ZEXT1632(auVar163),local_400,auVar135);
      auVar135 = vandps_avx(local_2e0,ZEXT1632(auVar14));
      auVar152 = vandps_avx(local_2e0,ZEXT1632(auVar15));
      auVar152 = vmaxps_avx(auVar135,auVar152);
      auVar135 = vandps_avx(ZEXT1632(auVar16),local_2e0);
      auVar135 = vmaxps_avx(auVar152,auVar135);
      auVar188._4_4_ = fVar143;
      auVar188._0_4_ = fVar143;
      auVar188._8_4_ = fVar143;
      auVar188._12_4_ = fVar143;
      auVar188._16_4_ = fVar143;
      auVar188._20_4_ = fVar143;
      auVar188._24_4_ = fVar143;
      auVar188._28_4_ = fVar143;
      auVar135 = vcmpps_avx(auVar135,auVar188,1);
      auVar154 = vblendvps_avx(ZEXT1632(auVar14),auVar127,auVar135);
      auVar151 = vblendvps_avx(ZEXT1632(auVar15),auVar149,auVar135);
      auVar135 = vandps_avx(ZEXT1632(auVar17),local_2e0);
      auVar152 = vandps_avx(ZEXT1632(auVar115),local_2e0);
      auVar124 = vmaxps_avx(auVar135,auVar152);
      auVar135 = vandps_avx(local_2e0,ZEXT1632(auVar163));
      auVar135 = vmaxps_avx(auVar124,auVar135);
      auVar124 = vcmpps_avx(auVar135,auVar188,1);
      auVar135 = vblendvps_avx(ZEXT1632(auVar17),auVar127,auVar124);
      auVar124 = vblendvps_avx(ZEXT1632(auVar115),auVar149,auVar124);
      auVar11 = vfmadd213ps_fma(auVar120,local_400,ZEXT1632(auVar11));
      auVar14 = vfmadd213ps_fma(auVar154,auVar154,ZEXT832(0) << 0x20);
      auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar151,auVar151);
      auVar120 = vrsqrtps_avx(ZEXT1632(auVar14));
      fVar143 = auVar120._0_4_;
      fVar125 = auVar120._4_4_;
      fVar138 = auVar120._8_4_;
      fVar139 = auVar120._12_4_;
      fVar140 = auVar120._16_4_;
      fVar141 = auVar120._20_4_;
      fVar142 = auVar120._24_4_;
      auVar39._4_4_ = fVar125 * fVar125 * fVar125 * auVar14._4_4_ * -0.5;
      auVar39._0_4_ = fVar143 * fVar143 * fVar143 * auVar14._0_4_ * -0.5;
      auVar39._8_4_ = fVar138 * fVar138 * fVar138 * auVar14._8_4_ * -0.5;
      auVar39._12_4_ = fVar139 * fVar139 * fVar139 * auVar14._12_4_ * -0.5;
      auVar39._16_4_ = fVar140 * fVar140 * fVar140 * -0.0;
      auVar39._20_4_ = fVar141 * fVar141 * fVar141 * -0.0;
      auVar39._24_4_ = fVar142 * fVar142 * fVar142 * -0.0;
      auVar39._28_4_ = auVar152._28_4_;
      auVar211._8_4_ = 0x3fc00000;
      auVar211._0_8_ = 0x3fc000003fc00000;
      auVar211._12_4_ = 0x3fc00000;
      auVar211._16_4_ = 0x3fc00000;
      auVar211._20_4_ = 0x3fc00000;
      auVar211._24_4_ = 0x3fc00000;
      auVar211._28_4_ = 0x3fc00000;
      auVar14 = vfmadd231ps_fma(auVar39,auVar211,auVar120);
      fVar143 = auVar14._0_4_;
      fVar125 = auVar14._4_4_;
      auVar40._4_4_ = fVar125 * auVar151._4_4_;
      auVar40._0_4_ = fVar143 * auVar151._0_4_;
      fVar138 = auVar14._8_4_;
      auVar40._8_4_ = fVar138 * auVar151._8_4_;
      fVar139 = auVar14._12_4_;
      auVar40._12_4_ = fVar139 * auVar151._12_4_;
      auVar40._16_4_ = auVar151._16_4_ * 0.0;
      auVar40._20_4_ = auVar151._20_4_ * 0.0;
      auVar40._24_4_ = auVar151._24_4_ * 0.0;
      auVar40._28_4_ = 0;
      auVar41._4_4_ = fVar125 * -auVar154._4_4_;
      auVar41._0_4_ = fVar143 * -auVar154._0_4_;
      auVar41._8_4_ = fVar138 * -auVar154._8_4_;
      auVar41._12_4_ = fVar139 * -auVar154._12_4_;
      auVar41._16_4_ = -auVar154._16_4_ * 0.0;
      auVar41._20_4_ = -auVar154._20_4_ * 0.0;
      auVar41._24_4_ = -auVar154._24_4_ * 0.0;
      auVar41._28_4_ = auVar120._28_4_;
      auVar14 = vfmadd213ps_fma(auVar135,auVar135,ZEXT832(0) << 0x20);
      auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar124,auVar124);
      auVar152 = vrsqrtps_avx(ZEXT1632(auVar14));
      auVar120 = ZEXT1632(CONCAT412(fVar139 * 0.0,
                                    CONCAT48(fVar138 * 0.0,CONCAT44(fVar125 * 0.0,fVar143 * 0.0))));
      fVar143 = auVar152._0_4_;
      fVar125 = auVar152._4_4_;
      fVar138 = auVar152._8_4_;
      fVar139 = auVar152._12_4_;
      fVar140 = auVar152._16_4_;
      fVar141 = auVar152._20_4_;
      fVar142 = auVar152._24_4_;
      auVar200._0_4_ = fVar143 * fVar143 * fVar143 * auVar14._0_4_ * -0.5;
      auVar200._4_4_ = fVar125 * fVar125 * fVar125 * auVar14._4_4_ * -0.5;
      auVar200._8_4_ = fVar138 * fVar138 * fVar138 * auVar14._8_4_ * -0.5;
      auVar200._12_4_ = fVar139 * fVar139 * fVar139 * auVar14._12_4_ * -0.5;
      auVar200._16_4_ = fVar140 * fVar140 * fVar140 * -0.0;
      auVar200._20_4_ = fVar141 * fVar141 * fVar141 * -0.0;
      auVar200._24_4_ = fVar142 * fVar142 * fVar142 * -0.0;
      auVar200._28_4_ = 0;
      auVar14 = vfmadd231ps_fma(auVar200,auVar211,auVar152);
      fVar143 = auVar14._0_4_;
      auVar196._0_4_ = auVar124._0_4_ * fVar143;
      fVar125 = auVar14._4_4_;
      auVar196._4_4_ = auVar124._4_4_ * fVar125;
      fVar138 = auVar14._8_4_;
      auVar196._8_4_ = auVar124._8_4_ * fVar138;
      fVar139 = auVar14._12_4_;
      auVar196._12_4_ = auVar124._12_4_ * fVar139;
      auVar196._16_4_ = auVar124._16_4_ * 0.0;
      auVar196._20_4_ = auVar124._20_4_ * 0.0;
      auVar196._24_4_ = auVar124._24_4_ * 0.0;
      auVar196._28_4_ = 0;
      auVar42._4_4_ = fVar125 * -auVar135._4_4_;
      auVar42._0_4_ = fVar143 * -auVar135._0_4_;
      auVar42._8_4_ = fVar138 * -auVar135._8_4_;
      auVar42._12_4_ = fVar139 * -auVar135._12_4_;
      auVar42._16_4_ = -auVar135._16_4_ * 0.0;
      auVar42._20_4_ = -auVar135._20_4_ * 0.0;
      auVar42._24_4_ = -auVar135._24_4_ * 0.0;
      auVar42._28_4_ = auVar154._28_4_ ^ 0x80000000;
      auVar43._28_4_ = auVar152._28_4_;
      auVar43._0_28_ =
           ZEXT1628(CONCAT412(fVar139 * 0.0,
                              CONCAT48(fVar138 * 0.0,CONCAT44(fVar125 * 0.0,fVar143 * 0.0))));
      auVar14 = vfmadd213ps_fma(auVar40,ZEXT1632(auVar12),local_360);
      auVar135 = ZEXT1632(auVar12);
      auVar15 = vfmadd213ps_fma(auVar41,auVar135,auVar117);
      auVar16 = vfmadd213ps_fma(auVar120,auVar135,ZEXT1632(auVar11));
      auVar163 = vfnmadd213ps_fma(auVar40,auVar135,local_360);
      auVar17 = vfmadd213ps_fma(auVar196,ZEXT1632(auVar13),local_320);
      auVar26 = vfnmadd213ps_fma(auVar41,auVar135,auVar117);
      auVar135 = ZEXT1632(auVar13);
      auVar115 = vfmadd213ps_fma(auVar42,auVar135,local_340);
      local_420 = ZEXT1632(auVar12);
      auVar144 = vfnmadd231ps_fma(ZEXT1632(auVar11),local_420,auVar120);
      auVar11 = vfmadd213ps_fma(auVar43,auVar135,ZEXT1632(auVar24));
      auVar27 = vfnmadd213ps_fma(auVar196,auVar135,local_320);
      auVar126 = vfnmadd213ps_fma(auVar42,auVar135,local_340);
      local_440 = ZEXT1632(auVar13);
      auVar164 = vfnmadd231ps_fma(ZEXT1632(auVar24),local_440,auVar43);
      auVar135 = vsubps_avx(ZEXT1632(auVar115),ZEXT1632(auVar26));
      auVar152 = vsubps_avx(ZEXT1632(auVar11),ZEXT1632(auVar144));
      auVar44._4_4_ = auVar144._4_4_ * auVar135._4_4_;
      auVar44._0_4_ = auVar144._0_4_ * auVar135._0_4_;
      auVar44._8_4_ = auVar144._8_4_ * auVar135._8_4_;
      auVar44._12_4_ = auVar144._12_4_ * auVar135._12_4_;
      auVar44._16_4_ = auVar135._16_4_ * 0.0;
      auVar44._20_4_ = auVar135._20_4_ * 0.0;
      auVar44._24_4_ = auVar135._24_4_ * 0.0;
      auVar44._28_4_ = 0;
      auVar12 = vfmsub231ps_fma(auVar44,ZEXT1632(auVar26),auVar152);
      auVar45._4_4_ = auVar152._4_4_ * auVar163._4_4_;
      auVar45._0_4_ = auVar152._0_4_ * auVar163._0_4_;
      auVar45._8_4_ = auVar152._8_4_ * auVar163._8_4_;
      auVar45._12_4_ = auVar152._12_4_ * auVar163._12_4_;
      auVar45._16_4_ = auVar152._16_4_ * 0.0;
      auVar45._20_4_ = auVar152._20_4_ * 0.0;
      auVar45._24_4_ = auVar152._24_4_ * 0.0;
      auVar45._28_4_ = auVar152._28_4_;
      auVar152 = vsubps_avx(ZEXT1632(auVar17),ZEXT1632(auVar163));
      auVar24 = vfmsub231ps_fma(auVar45,ZEXT1632(auVar144),auVar152);
      auVar46._4_4_ = auVar26._4_4_ * auVar152._4_4_;
      auVar46._0_4_ = auVar26._0_4_ * auVar152._0_4_;
      auVar46._8_4_ = auVar26._8_4_ * auVar152._8_4_;
      auVar46._12_4_ = auVar26._12_4_ * auVar152._12_4_;
      auVar46._16_4_ = auVar152._16_4_ * 0.0;
      auVar46._20_4_ = auVar152._20_4_ * 0.0;
      auVar46._24_4_ = auVar152._24_4_ * 0.0;
      auVar46._28_4_ = auVar152._28_4_;
      auVar151 = ZEXT1632(auVar163);
      auVar13 = vfmsub231ps_fma(auVar46,auVar151,auVar135);
      auVar135 = ZEXT1232(ZEXT412(0)) << 0x20;
      auVar24 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar135,ZEXT1632(auVar24));
      auVar24 = vfmadd231ps_fma(ZEXT1632(auVar24),auVar135,ZEXT1632(auVar12));
      auVar22 = vcmpps_avx(ZEXT1632(auVar24),ZEXT1232(ZEXT412(0)) << 0x20,2);
      _local_7a0 = vblendvps_avx(ZEXT1632(auVar27),ZEXT1632(auVar14),auVar22);
      local_680 = vblendvps_avx(ZEXT1632(auVar126),ZEXT1632(auVar15),auVar22);
      auVar135 = vblendvps_avx(ZEXT1632(auVar164),ZEXT1632(auVar16),auVar22);
      auVar152 = vblendvps_avx(auVar151,ZEXT1632(auVar17),auVar22);
      auVar154 = vblendvps_avx(ZEXT1632(auVar26),ZEXT1632(auVar115),auVar22);
      auVar120 = vblendvps_avx(ZEXT1632(auVar144),ZEXT1632(auVar11),auVar22);
      auVar151 = vblendvps_avx(ZEXT1632(auVar17),auVar151,auVar22);
      auVar124 = vblendvps_avx(ZEXT1632(auVar115),ZEXT1632(auVar26),auVar22);
      auVar24 = vpackssdw_avx(local_380._0_16_,local_380._16_16_);
      local_780 = ZEXT1632(auVar24);
      auVar189 = vblendvps_avx(ZEXT1632(auVar11),ZEXT1632(auVar144),auVar22);
      auVar127 = vsubps_avx(auVar151,_local_7a0);
      auVar124 = vsubps_avx(auVar124,local_680);
      auVar149 = vsubps_avx(auVar189,auVar135);
      auVar161 = vsubps_avx(_local_7a0,auVar152);
      auVar168 = vsubps_avx(local_680,auVar154);
      auVar117 = vsubps_avx(auVar135,auVar120);
      auVar47._4_4_ = auVar149._4_4_ * local_7a0._4_4_;
      auVar47._0_4_ = auVar149._0_4_ * local_7a0._0_4_;
      auVar47._8_4_ = auVar149._8_4_ * local_7a0._8_4_;
      auVar47._12_4_ = auVar149._12_4_ * local_7a0._12_4_;
      auVar47._16_4_ = auVar149._16_4_ * local_7a0._16_4_;
      auVar47._20_4_ = auVar149._20_4_ * local_7a0._20_4_;
      auVar47._24_4_ = auVar149._24_4_ * local_7a0._24_4_;
      auVar47._28_4_ = auVar189._28_4_;
      auVar11 = vfmsub231ps_fma(auVar47,auVar135,auVar127);
      auVar48._4_4_ = auVar127._4_4_ * local_680._4_4_;
      auVar48._0_4_ = auVar127._0_4_ * local_680._0_4_;
      auVar48._8_4_ = auVar127._8_4_ * local_680._8_4_;
      auVar48._12_4_ = auVar127._12_4_ * local_680._12_4_;
      auVar48._16_4_ = auVar127._16_4_ * local_680._16_4_;
      auVar48._20_4_ = auVar127._20_4_ * local_680._20_4_;
      auVar48._24_4_ = auVar127._24_4_ * local_680._24_4_;
      auVar48._28_4_ = auVar151._28_4_;
      auVar12 = vfmsub231ps_fma(auVar48,_local_7a0,auVar124);
      auVar11 = vfmadd231ps_fma(ZEXT1632(auVar12),ZEXT832(0) << 0x20,ZEXT1632(auVar11));
      auVar121._0_4_ = auVar124._0_4_ * auVar135._0_4_;
      auVar121._4_4_ = auVar124._4_4_ * auVar135._4_4_;
      auVar121._8_4_ = auVar124._8_4_ * auVar135._8_4_;
      auVar121._12_4_ = auVar124._12_4_ * auVar135._12_4_;
      auVar121._16_4_ = auVar124._16_4_ * auVar135._16_4_;
      auVar121._20_4_ = auVar124._20_4_ * auVar135._20_4_;
      auVar121._24_4_ = auVar124._24_4_ * auVar135._24_4_;
      auVar121._28_4_ = 0;
      auVar12 = vfmsub231ps_fma(auVar121,local_680,auVar149);
      auVar12 = vfmadd231ps_fma(ZEXT1632(auVar11),ZEXT832(0) << 0x20,ZEXT1632(auVar12));
      auVar122._0_4_ = auVar117._0_4_ * auVar152._0_4_;
      auVar122._4_4_ = auVar117._4_4_ * auVar152._4_4_;
      auVar122._8_4_ = auVar117._8_4_ * auVar152._8_4_;
      auVar122._12_4_ = auVar117._12_4_ * auVar152._12_4_;
      auVar122._16_4_ = auVar117._16_4_ * auVar152._16_4_;
      auVar122._20_4_ = auVar117._20_4_ * auVar152._20_4_;
      auVar122._24_4_ = auVar117._24_4_ * auVar152._24_4_;
      auVar122._28_4_ = 0;
      auVar11 = vfmsub231ps_fma(auVar122,auVar161,auVar120);
      auVar130._0_4_ = auVar168._0_4_ * auVar120._0_4_;
      auVar130._4_4_ = auVar168._4_4_ * auVar120._4_4_;
      auVar130._8_4_ = auVar168._8_4_ * auVar120._8_4_;
      auVar130._12_4_ = auVar168._12_4_ * auVar120._12_4_;
      auVar130._16_4_ = auVar168._16_4_ * auVar120._16_4_;
      auVar130._20_4_ = auVar168._20_4_ * auVar120._20_4_;
      auVar130._24_4_ = auVar168._24_4_ * auVar120._24_4_;
      auVar130._28_4_ = 0;
      auVar13 = vfmsub231ps_fma(auVar130,auVar154,auVar117);
      auVar49._4_4_ = auVar161._4_4_ * auVar154._4_4_;
      auVar49._0_4_ = auVar161._0_4_ * auVar154._0_4_;
      auVar49._8_4_ = auVar161._8_4_ * auVar154._8_4_;
      auVar49._12_4_ = auVar161._12_4_ * auVar154._12_4_;
      auVar49._16_4_ = auVar161._16_4_ * auVar154._16_4_;
      auVar49._20_4_ = auVar161._20_4_ * auVar154._20_4_;
      auVar49._24_4_ = auVar161._24_4_ * auVar154._24_4_;
      auVar49._28_4_ = auVar154._28_4_;
      auVar14 = vfmsub231ps_fma(auVar49,auVar168,auVar152);
      auVar11 = vfmadd231ps_fma(ZEXT1632(auVar14),ZEXT832(0) << 0x20,ZEXT1632(auVar11));
      auVar13 = vfmadd231ps_fma(ZEXT1632(auVar11),ZEXT832(0) << 0x20,ZEXT1632(auVar13));
      auVar154 = vmaxps_avx(ZEXT1632(auVar12),ZEXT1632(auVar13));
      auVar154 = vcmpps_avx(auVar154,ZEXT832(0) << 0x20,2);
      auVar11 = vpackssdw_avx(auVar154._0_16_,auVar154._16_16_);
      auVar24 = vpand_avx(auVar11,auVar24);
      auVar154 = vpmovsxwd_avx2(auVar24);
      if ((((((((auVar154 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar154 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar154 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar154 >> 0x7f,0) == '\0') &&
            (auVar154 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar154 >> 0xbf,0) == '\0') &&
          (auVar154 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
          -1 < auVar154[0x1f]) {
LAB_01376b43:
        auVar160 = ZEXT3264(CONCAT824(uStack_488,
                                      CONCAT816(uStack_490,CONCAT88(uStack_498,local_4a0))));
        auVar198 = ZEXT3264(auVar195);
        auVar203 = ZEXT3264(auVar133);
      }
      else {
        local_780 = ZEXT1632(auVar24);
        auVar131._0_4_ = auVar124._0_4_ * auVar117._0_4_;
        auVar131._4_4_ = auVar124._4_4_ * auVar117._4_4_;
        auVar131._8_4_ = auVar124._8_4_ * auVar117._8_4_;
        auVar131._12_4_ = auVar124._12_4_ * auVar117._12_4_;
        auVar131._16_4_ = auVar124._16_4_ * auVar117._16_4_;
        auVar131._20_4_ = auVar124._20_4_ * auVar117._20_4_;
        auVar131._24_4_ = auVar124._24_4_ * auVar117._24_4_;
        auVar131._28_4_ = 0;
        auVar16 = vfmsub231ps_fma(auVar131,auVar168,auVar149);
        auVar50._4_4_ = auVar149._4_4_ * auVar161._4_4_;
        auVar50._0_4_ = auVar149._0_4_ * auVar161._0_4_;
        auVar50._8_4_ = auVar149._8_4_ * auVar161._8_4_;
        auVar50._12_4_ = auVar149._12_4_ * auVar161._12_4_;
        auVar50._16_4_ = auVar149._16_4_ * auVar161._16_4_;
        auVar50._20_4_ = auVar149._20_4_ * auVar161._20_4_;
        auVar50._24_4_ = auVar149._24_4_ * auVar161._24_4_;
        auVar50._28_4_ = auVar152._28_4_;
        auVar15 = vfmsub231ps_fma(auVar50,auVar127,auVar117);
        auVar51._4_4_ = auVar127._4_4_ * auVar168._4_4_;
        auVar51._0_4_ = auVar127._0_4_ * auVar168._0_4_;
        auVar51._8_4_ = auVar127._8_4_ * auVar168._8_4_;
        auVar51._12_4_ = auVar127._12_4_ * auVar168._12_4_;
        auVar51._16_4_ = auVar127._16_4_ * auVar168._16_4_;
        auVar51._20_4_ = auVar127._20_4_ * auVar168._20_4_;
        auVar51._24_4_ = auVar127._24_4_ * auVar168._24_4_;
        auVar51._28_4_ = auVar127._28_4_;
        auVar17 = vfmsub231ps_fma(auVar51,auVar161,auVar124);
        auVar11 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar15),ZEXT1632(auVar17));
        auVar14 = vfmadd231ps_fma(ZEXT1632(auVar11),ZEXT1632(auVar16),ZEXT832(0) << 0x20);
        auVar152 = vrcpps_avx(ZEXT1632(auVar14));
        auVar197._8_4_ = 0x3f800000;
        auVar197._0_8_ = 0x3f8000003f800000;
        auVar197._12_4_ = 0x3f800000;
        auVar197._16_4_ = 0x3f800000;
        auVar197._20_4_ = 0x3f800000;
        auVar197._24_4_ = 0x3f800000;
        auVar197._28_4_ = 0x3f800000;
        auVar11 = vfnmadd213ps_fma(auVar152,ZEXT1632(auVar14),auVar197);
        auVar11 = vfmadd132ps_fma(ZEXT1632(auVar11),auVar152,auVar152);
        auVar52._4_4_ = auVar17._4_4_ * auVar135._4_4_;
        auVar52._0_4_ = auVar17._0_4_ * auVar135._0_4_;
        auVar52._8_4_ = auVar17._8_4_ * auVar135._8_4_;
        auVar52._12_4_ = auVar17._12_4_ * auVar135._12_4_;
        auVar52._16_4_ = auVar135._16_4_ * 0.0;
        auVar52._20_4_ = auVar135._20_4_ * 0.0;
        auVar52._24_4_ = auVar135._24_4_ * 0.0;
        auVar52._28_4_ = auVar135._28_4_;
        auVar15 = vfmadd231ps_fma(auVar52,ZEXT1632(auVar15),local_680);
        auVar15 = vfmadd231ps_fma(ZEXT1632(auVar15),ZEXT1632(auVar16),_local_7a0);
        fVar125 = auVar11._0_4_;
        fVar138 = auVar11._4_4_;
        fVar139 = auVar11._8_4_;
        fVar140 = auVar11._12_4_;
        auVar53._28_4_ = auVar120._28_4_;
        auVar53._0_28_ =
             ZEXT1628(CONCAT412(fVar140 * auVar15._12_4_,
                                CONCAT48(fVar139 * auVar15._8_4_,
                                         CONCAT44(fVar138 * auVar15._4_4_,fVar125 * auVar15._0_4_)))
                     );
        auVar132._8_8_ = local_540._0_8_;
        auVar132._0_8_ = local_540._0_8_;
        auVar132._16_8_ = local_540._0_8_;
        auVar132._24_8_ = local_540._0_8_;
        fVar143 = ray->tfar;
        auVar162._4_4_ = fVar143;
        auVar162._0_4_ = fVar143;
        auVar162._8_4_ = fVar143;
        auVar162._12_4_ = fVar143;
        auVar162._16_4_ = fVar143;
        auVar162._20_4_ = fVar143;
        auVar162._24_4_ = fVar143;
        auVar162._28_4_ = fVar143;
        auVar135 = vcmpps_avx(auVar132,auVar53,2);
        auVar152 = vcmpps_avx(auVar53,auVar162,2);
        auVar135 = vandps_avx(auVar152,auVar135);
        auVar11 = vpackssdw_avx(auVar135._0_16_,auVar135._16_16_);
        auVar24 = vpand_avx(auVar11,auVar24);
        auVar135 = vpmovsxwd_avx2(auVar24);
        if ((((((((auVar135 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar135 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar135 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar135 >> 0x7f,0) == '\0') &&
              (auVar135 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar135 >> 0xbf,0) == '\0') &&
            (auVar135 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar135[0x1f]) goto LAB_01376b43;
        auVar135 = vcmpps_avx(ZEXT832(0) << 0x20,ZEXT1632(auVar14),4);
        auVar11 = vpackssdw_avx(auVar135._0_16_,auVar135._16_16_);
        auVar24 = vpand_avx(auVar24,auVar11);
        auVar135 = vpmovsxwd_avx2(auVar24);
        auVar160 = ZEXT3264(CONCAT824(uStack_488,
                                      CONCAT816(uStack_490,CONCAT88(uStack_498,local_4a0))));
        auVar198 = ZEXT3264(auVar195);
        auVar203 = ZEXT3264(auVar133);
        if ((((((((auVar135 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar135 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar135 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar135 >> 0x7f,0) != '\0') ||
              (auVar135 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar135 >> 0xbf,0) != '\0') ||
            (auVar135 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar135[0x1f] < '\0') {
          auVar133 = ZEXT1632(CONCAT412(fVar140 * auVar12._12_4_,
                                        CONCAT48(fVar139 * auVar12._8_4_,
                                                 CONCAT44(fVar138 * auVar12._4_4_,
                                                          fVar125 * auVar12._0_4_))));
          auVar152 = ZEXT1632(CONCAT412(fVar140 * auVar13._12_4_,
                                        CONCAT48(fVar139 * auVar13._8_4_,
                                                 CONCAT44(fVar138 * auVar13._4_4_,
                                                          fVar125 * auVar13._0_4_))));
          auVar174._8_4_ = 0x3f800000;
          auVar174._0_8_ = 0x3f8000003f800000;
          auVar174._12_4_ = 0x3f800000;
          auVar174._16_4_ = 0x3f800000;
          auVar174._20_4_ = 0x3f800000;
          auVar174._24_4_ = 0x3f800000;
          auVar174._28_4_ = 0x3f800000;
          auVar195 = vsubps_avx(auVar174,auVar133);
          auVar195 = vblendvps_avx(auVar195,auVar133,auVar22);
          auVar198 = ZEXT3264(auVar195);
          auVar195 = vsubps_avx(auVar174,auVar152);
          local_3a0 = vblendvps_avx(auVar195,auVar152,auVar22);
          auVar160 = ZEXT3264(auVar135);
          auVar203 = ZEXT3264(auVar53);
        }
      }
      auVar213 = ZEXT3264(local_6c0);
      auVar194 = ZEXT3264(local_6a0);
      auVar192 = ZEXT3264(local_6e0);
      auVar135 = auVar160._0_32_;
      auVar216 = ZEXT3264(local_5c0);
      if ((((((((auVar135 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar135 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar135 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar135 >> 0x7f,0) == '\0') &&
            (auVar160 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
           SUB321(auVar135 >> 0xbf,0) == '\0') &&
          (auVar160 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
          -1 < auVar160[0x1f]) goto LAB_013759b4;
      auVar195 = vsubps_avx(local_440,local_420);
      local_2c0 = auVar198._0_32_;
      auVar24 = vfmadd213ps_fma(auVar195,local_2c0,local_420);
      fVar143 = local_728->depth_scale;
      auVar54._4_4_ = (auVar24._4_4_ + auVar24._4_4_) * fVar143;
      auVar54._0_4_ = (auVar24._0_4_ + auVar24._0_4_) * fVar143;
      auVar54._8_4_ = (auVar24._8_4_ + auVar24._8_4_) * fVar143;
      auVar54._12_4_ = (auVar24._12_4_ + auVar24._12_4_) * fVar143;
      auVar54._16_4_ = fVar143 * 0.0;
      auVar54._20_4_ = fVar143 * 0.0;
      auVar54._24_4_ = fVar143 * 0.0;
      auVar54._28_4_ = 0;
      local_280 = auVar203._0_32_;
      auVar195 = vcmpps_avx(local_280,auVar54,6);
      auVar133 = auVar135 & auVar195;
      auVar178 = ZEXT3264(CONCAT428(local_580,
                                    CONCAT424(local_580,
                                              CONCAT420(local_580,
                                                        CONCAT416(local_580,
                                                                  CONCAT412(local_580,
                                                                            CONCAT48(local_580,
                                                                                     CONCAT44(
                                                  local_580,local_580))))))));
      auVar181 = ZEXT3264(CONCAT428(fStack_59c,
                                    CONCAT424(local_5a0,
                                              CONCAT420(fStack_59c,
                                                        CONCAT416(local_5a0,
                                                                  CONCAT412(fStack_59c,
                                                                            CONCAT48(local_5a0,
                                                                                     auVar10._0_8_))
                                                                 )))));
      auVar185 = ZEXT3264(local_640);
      auVar160 = ZEXT3264(local_520);
      if ((((((((auVar133 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar133 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar133 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar133 >> 0x7f,0) == '\0') &&
            (auVar133 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar133 >> 0xbf,0) == '\0') &&
          (auVar133 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
          -1 < auVar133[0x1f]) {
LAB_01375a7d:
        bVar111 = 0;
      }
      else {
        auVar134._8_4_ = 0xbf800000;
        auVar134._0_8_ = 0xbf800000bf800000;
        auVar134._12_4_ = 0xbf800000;
        auVar134._16_4_ = 0xbf800000;
        auVar134._20_4_ = 0xbf800000;
        auVar134._24_4_ = 0xbf800000;
        auVar134._28_4_ = 0xbf800000;
        auVar153._8_4_ = 0x40000000;
        auVar153._0_8_ = 0x4000000040000000;
        auVar153._12_4_ = 0x40000000;
        auVar153._16_4_ = 0x40000000;
        auVar153._20_4_ = 0x40000000;
        auVar153._24_4_ = 0x40000000;
        auVar153._28_4_ = 0x40000000;
        auVar24 = vfmadd213ps_fma(local_3a0,auVar153,auVar134);
        local_2a0 = ZEXT1632(auVar24);
        local_260 = 0;
        local_25c = iVar19;
        local_250 = *(undefined8 *)*pauVar1;
        uStack_248 = *(undefined8 *)(*pauVar1 + 8);
        local_240 = *(undefined8 *)*pauVar2;
        uStack_238 = *(undefined8 *)(*pauVar2 + 8);
        local_230 = *(undefined8 *)*pauVar3;
        uStack_228 = *(undefined8 *)(*pauVar3 + 8);
        local_3a0 = ZEXT1632(auVar24);
        auVar133 = local_3a0;
        if ((pGVar20->mask & ray->mask) == 0) {
          bVar111 = 0;
          auVar160 = ZEXT3264(local_520);
        }
        else {
          auVar160 = ZEXT3264(local_520);
          if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
             (bVar111 = 1, pGVar20->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
            auVar135 = vandps_avx(auVar195,auVar135);
            fVar143 = 1.0 / auVar129._0_4_;
            local_1e0[0] = fVar143 * (auVar198._0_4_ + 0.0);
            local_1e0[1] = fVar143 * (auVar198._4_4_ + 1.0);
            local_1e0[2] = fVar143 * (auVar198._8_4_ + 2.0);
            local_1e0[3] = fVar143 * (auVar198._12_4_ + 3.0);
            fStack_1d0 = fVar143 * (auVar198._16_4_ + 4.0);
            fStack_1cc = fVar143 * (auVar198._20_4_ + 5.0);
            fStack_1c8 = fVar143 * (auVar198._24_4_ + 6.0);
            fStack_1c4 = auVar198._28_4_ + 7.0;
            local_3a0._0_8_ = auVar24._0_8_;
            local_3a0._8_8_ = auVar24._8_8_;
            local_1c0 = local_3a0._0_8_;
            uStack_1b8 = local_3a0._8_8_;
            uStack_1b0 = 0;
            uStack_1a8 = 0;
            local_1a0 = local_280;
            uVar112 = vmovmskps_avx(auVar135);
            lVar108 = 0;
            uVar109 = CONCAT44((int)((ulong)context->args >> 0x20),uVar112);
            for (uVar107 = uVar109; (uVar107 & 1) == 0; uVar107 = uVar107 >> 1 | 0x8000000000000000)
            {
              lVar108 = lVar108 + 1;
            }
            local_700 = local_2c0;
            local_720 = local_280;
            local_3a0 = auVar133;
            while (uVar109 != 0) {
              local_780._0_8_ = uVar109;
              local_4f4 = local_1e0[lVar108];
              local_4f0 = *(undefined4 *)((long)&local_1c0 + lVar108 * 4);
              local_680._0_4_ = ray->tfar;
              local_7a0 = (undefined1  [8])lVar108;
              ray->tfar = *(float *)(local_1a0 + lVar108 * 4);
              local_5f0.context = context->user;
              fVar125 = 1.0 - local_4f4;
              fVar143 = fVar125 * fVar125 * -3.0;
              auVar24 = vfmadd231ss_fma(ZEXT416((uint)(fVar125 * fVar125)),
                                        ZEXT416((uint)(local_4f4 * fVar125)),ZEXT416(0xc0000000));
              auVar10 = vfmsub132ss_fma(ZEXT416((uint)(local_4f4 * fVar125)),
                                        ZEXT416((uint)(local_4f4 * local_4f4)),ZEXT416(0x40000000));
              fVar125 = auVar24._0_4_ * 3.0;
              fVar138 = auVar10._0_4_ * 3.0;
              fVar139 = local_4f4 * local_4f4 * 3.0;
              auVar166._0_4_ = fVar139 * local_4c0;
              auVar166._4_4_ = fVar139 * fStack_4bc;
              auVar166._8_4_ = fVar139 * fStack_4b8;
              auVar166._12_4_ = fVar139 * fStack_4b4;
              auVar145._4_4_ = fVar138;
              auVar145._0_4_ = fVar138;
              auVar145._8_4_ = fVar138;
              auVar145._12_4_ = fVar138;
              auVar96._8_8_ = uStack_618;
              auVar96._0_8_ = local_620;
              auVar24 = vfmadd132ps_fma(auVar145,auVar166,auVar96);
              auVar156._4_4_ = fVar125;
              auVar156._0_4_ = fVar125;
              auVar156._8_4_ = fVar125;
              auVar156._12_4_ = fVar125;
              auVar98._8_8_ = uStack_608;
              auVar98._0_8_ = local_610;
              auVar24 = vfmadd132ps_fma(auVar156,auVar24,auVar98);
              auVar146._4_4_ = fVar143;
              auVar146._0_4_ = fVar143;
              auVar146._8_4_ = fVar143;
              auVar146._12_4_ = fVar143;
              auVar100._8_8_ = uStack_5f8;
              auVar100._0_8_ = local_600;
              auVar24 = vfmadd132ps_fma(auVar146,auVar24,auVar100);
              local_500 = vmovlps_avx(auVar24);
              local_4f8 = vextractps_avx(auVar24,2);
              local_4ec = (int)local_4c8;
              local_4e8 = (int)local_730;
              local_4e4 = (local_5f0.context)->instID[0];
              local_4e0 = (local_5f0.context)->instPrimID[0];
              local_7b4 = -1;
              local_5f0.valid = &local_7b4;
              local_5f0.geometryUserPtr = pGVar20->userPtr;
              local_5f0.ray = (RTCRayN *)ray;
              local_5f0.hit = (RTCHitN *)&local_500;
              local_5f0.N = 1;
              if ((pGVar20->occlusionFilterN == (RTCFilterFunctionN)0x0) ||
                 ((*pGVar20->occlusionFilterN)(&local_5f0), *local_5f0.valid != 0)) {
                p_Var21 = context->args->filter;
                if ((p_Var21 == (RTCFilterFunctionN)0x0) ||
                   ((((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) ==
                      RTC_RAY_QUERY_FLAG_INCOHERENT && (((pGVar20->field_8).field_0x2 & 0x40) == 0))
                    || ((*p_Var21)(&local_5f0), *local_5f0.valid != 0)))) {
                  bVar111 = 1;
                  auVar194 = ZEXT3264(local_6a0);
                  auVar192 = ZEXT3264(local_6e0);
                  auVar198 = ZEXT3264(local_700);
                  auVar203 = ZEXT3264(local_720);
                  auVar213 = ZEXT3264(local_6c0);
                  auVar216 = ZEXT3264(local_5c0);
                  auVar178 = ZEXT3264(CONCAT428(fStack_564,
                                                CONCAT424(fStack_568,
                                                          CONCAT420(fStack_56c,
                                                                    CONCAT416(fStack_570,
                                                                              CONCAT412(fStack_574,
                                                                                        CONCAT48(
                                                  fStack_578,CONCAT44(fStack_57c,local_580))))))));
                  auVar181 = ZEXT3264(CONCAT428(fStack_584,
                                                CONCAT424(fStack_588,
                                                          CONCAT420(fStack_58c,
                                                                    CONCAT416(fStack_590,
                                                                              CONCAT412(fStack_594,
                                                                                        CONCAT48(
                                                  fStack_598,CONCAT44(fStack_59c,local_5a0))))))));
                  auVar185 = ZEXT3264(local_640);
                  auVar160 = ZEXT3264(local_520);
                  uVar114 = local_560;
                  uVar208 = uStack_558;
                  goto LAB_013759d8;
                }
              }
              ray->tfar = (float)local_680._0_4_;
              lVar108 = 0;
              uVar109 = local_780._0_8_ ^ 1L << ((ulong)local_7a0 & 0x3f);
              for (uVar107 = uVar109; (uVar107 & 1) == 0;
                  uVar107 = uVar107 >> 1 | 0x8000000000000000) {
                lVar108 = lVar108 + 1;
              }
              auVar194 = ZEXT3264(local_6a0);
              auVar192 = ZEXT3264(local_6e0);
              auVar198 = ZEXT3264(local_700);
              auVar203 = ZEXT3264(local_720);
              auVar213 = ZEXT3264(local_6c0);
              auVar216 = ZEXT3264(local_5c0);
              auVar178 = ZEXT3264(CONCAT428(fStack_564,
                                            CONCAT424(fStack_568,
                                                      CONCAT420(fStack_56c,
                                                                CONCAT416(fStack_570,
                                                                          CONCAT412(fStack_574,
                                                                                    CONCAT48(
                                                  fStack_578,CONCAT44(fStack_57c,local_580))))))));
              auVar181 = ZEXT3264(CONCAT428(fStack_584,
                                            CONCAT424(fStack_588,
                                                      CONCAT420(fStack_58c,
                                                                CONCAT416(fStack_590,
                                                                          CONCAT412(fStack_594,
                                                                                    CONCAT48(
                                                  fStack_598,CONCAT44(fStack_59c,local_5a0))))))));
              auVar185 = ZEXT3264(local_640);
              auVar160 = ZEXT3264(local_520);
              uVar114 = local_560;
              uVar208 = uStack_558;
            }
            goto LAB_01375a7d;
          }
        }
      }
    }
LAB_013759d8:
    auVar137 = ZEXT3264(local_660);
    if (8 < iVar19) {
      local_380._4_4_ = iVar19;
      local_380._0_4_ = iVar19;
      local_380._8_4_ = iVar19;
      local_380._12_4_ = iVar19;
      local_380._16_4_ = iVar19;
      local_380._20_4_ = iVar19;
      local_380._24_4_ = iVar19;
      local_380._28_4_ = iVar19;
      local_140 = local_760._0_4_;
      uStack_13c = local_760._0_4_;
      uStack_138 = local_760._0_4_;
      uStack_134 = local_760._0_4_;
      uStack_130 = local_760._0_4_;
      uStack_12c = local_760._0_4_;
      uStack_128 = local_760._0_4_;
      uStack_124 = local_760._0_4_;
      local_160 = local_540._0_8_;
      uStack_158 = local_540._0_8_;
      uStack_150 = local_540._0_8_;
      uStack_148 = local_540._0_8_;
      local_180 = 1.0 / (float)local_3e0._0_4_;
      fStack_17c = local_180;
      fStack_178 = local_180;
      fStack_174 = local_180;
      fStack_170 = local_180;
      fStack_16c = local_180;
      fStack_168 = local_180;
      fStack_164 = local_180;
      lVar108 = 8;
      local_700 = auVar198._0_32_;
      local_720 = auVar203._0_32_;
      uStack_558 = uVar208;
      local_560 = uVar114;
LAB_01375ebc:
      if (lVar108 < local_7b0) {
        auVar189 = auVar192._0_32_;
        auVar135 = *(undefined1 (*) [32])(bezier_basis0 + lVar108 * 4 + lVar110);
        local_760 = *(undefined1 (*) [32])(lVar110 + 0x21fb768 + lVar108 * 4);
        auVar195 = *(undefined1 (*) [32])(lVar110 + 0x21fbbec + lVar108 * 4);
        pauVar5 = (undefined1 (*) [28])(lVar110 + 0x21fc070 + lVar108 * 4);
        auVar104 = *pauVar5;
        auVar204._0_4_ = auVar178._0_4_ * *(float *)*pauVar5;
        auVar204._4_4_ = auVar178._4_4_ * *(float *)(*pauVar5 + 4);
        auVar204._8_4_ = auVar178._8_4_ * *(float *)(*pauVar5 + 8);
        auVar204._12_4_ = auVar178._12_4_ * *(float *)(*pauVar5 + 0xc);
        auVar204._16_4_ = auVar178._16_4_ * *(float *)(*pauVar5 + 0x10);
        auVar204._20_4_ = auVar178._20_4_ * *(float *)(*pauVar5 + 0x14);
        auVar204._28_36_ = auVar203._28_36_;
        auVar204._24_4_ = auVar178._24_4_ * *(float *)(*pauVar5 + 0x18);
        auVar55._4_4_ = auVar181._4_4_ * *(float *)(*pauVar5 + 4);
        auVar55._0_4_ = auVar181._0_4_ * *(float *)*pauVar5;
        auVar55._8_4_ = auVar181._8_4_ * *(float *)(*pauVar5 + 8);
        auVar55._12_4_ = auVar181._12_4_ * *(float *)(*pauVar5 + 0xc);
        auVar55._16_4_ = auVar181._16_4_ * *(float *)(*pauVar5 + 0x10);
        auVar55._20_4_ = auVar181._20_4_ * *(float *)(*pauVar5 + 0x14);
        auVar55._24_4_ = auVar181._24_4_ * *(float *)(*pauVar5 + 0x18);
        auVar55._28_4_ = *(undefined4 *)pauVar5[1];
        auVar24 = vfmadd231ps_fma(auVar204._0_32_,auVar195,auVar213._0_32_);
        auVar10 = vfmadd231ps_fma(auVar55,auVar195,auVar216._0_32_);
        auVar24 = vfmadd231ps_fma(ZEXT1632(auVar24),local_760,auVar185._0_32_);
        auVar10 = vfmadd231ps_fma(ZEXT1632(auVar10),local_760,auVar137._0_32_);
        auVar24 = vfmadd231ps_fma(ZEXT1632(auVar24),auVar135,auVar160._0_32_);
        auVar10 = vfmadd231ps_fma(ZEXT1632(auVar10),auVar135,local_480);
        auVar133 = *(undefined1 (*) [32])(bezier_basis1 + lVar108 * 4 + lVar110);
        auVar152 = *(undefined1 (*) [32])(lVar110 + 0x21fdb88 + lVar108 * 4);
        auVar154 = *(undefined1 (*) [32])(lVar110 + 0x21fe00c + lVar108 * 4);
        pfVar6 = (float *)(lVar110 + 0x21fe490 + lVar108 * 4);
        fVar23 = *pfVar6;
        fVar205 = pfVar6[1];
        fVar207 = pfVar6[2];
        fVar84 = pfVar6[3];
        fVar85 = pfVar6[4];
        fVar86 = pfVar6[5];
        fVar87 = pfVar6[6];
        auVar182._0_4_ = fVar23 * auVar178._0_4_;
        auVar182._4_4_ = fVar205 * auVar178._4_4_;
        auVar182._8_4_ = fVar207 * auVar178._8_4_;
        auVar182._12_4_ = fVar84 * auVar178._12_4_;
        auVar182._16_4_ = fVar85 * auVar178._16_4_;
        auVar182._20_4_ = fVar86 * auVar178._20_4_;
        auVar182._28_36_ = auVar181._28_36_;
        auVar182._24_4_ = fVar87 * auVar178._24_4_;
        auVar179._0_4_ = fVar23 * auVar181._0_4_;
        auVar179._4_4_ = fVar205 * auVar181._4_4_;
        auVar179._8_4_ = fVar207 * auVar181._8_4_;
        auVar179._12_4_ = fVar84 * auVar181._12_4_;
        auVar179._16_4_ = fVar85 * auVar181._16_4_;
        auVar179._20_4_ = fVar86 * auVar181._20_4_;
        auVar179._28_36_ = auVar178._28_36_;
        auVar179._24_4_ = fVar87 * auVar181._24_4_;
        auVar11 = vfmadd231ps_fma(auVar182._0_32_,auVar154,auVar213._0_32_);
        auVar12 = vfmadd231ps_fma(auVar179._0_32_,auVar154,auVar216._0_32_);
        auVar11 = vfmadd231ps_fma(ZEXT1632(auVar11),auVar152,auVar185._0_32_);
        auVar12 = vfmadd231ps_fma(ZEXT1632(auVar12),auVar152,auVar137._0_32_);
        auVar11 = vfmadd231ps_fma(ZEXT1632(auVar11),auVar133,auVar160._0_32_);
        auVar12 = vfmadd231ps_fma(ZEXT1632(auVar12),auVar133,local_480);
        local_340 = ZEXT1632(auVar11);
        _local_460 = ZEXT1632(auVar24);
        local_320 = vsubps_avx(local_340,_local_460);
        local_440 = ZEXT1632(auVar12);
        local_420 = ZEXT1632(auVar10);
        local_360 = vsubps_avx(local_440,local_420);
        auVar56._4_4_ = auVar10._4_4_ * local_320._4_4_;
        auVar56._0_4_ = auVar10._0_4_ * local_320._0_4_;
        auVar56._8_4_ = auVar10._8_4_ * local_320._8_4_;
        auVar56._12_4_ = auVar10._12_4_ * local_320._12_4_;
        auVar56._16_4_ = local_320._16_4_ * 0.0;
        auVar56._20_4_ = local_320._20_4_ * 0.0;
        auVar56._24_4_ = local_320._24_4_ * 0.0;
        auVar56._28_4_ = auVar181._28_4_;
        fVar143 = local_360._0_4_;
        auVar203._0_4_ = auVar24._0_4_ * fVar143;
        fVar125 = local_360._4_4_;
        auVar203._4_4_ = auVar24._4_4_ * fVar125;
        fVar138 = local_360._8_4_;
        auVar203._8_4_ = auVar24._8_4_ * fVar138;
        fVar139 = local_360._12_4_;
        auVar203._12_4_ = auVar24._12_4_ * fVar139;
        fVar140 = local_360._16_4_;
        auVar203._16_4_ = fVar140 * 0.0;
        fVar141 = local_360._20_4_;
        auVar203._20_4_ = fVar141 * 0.0;
        fVar142 = local_360._24_4_;
        auVar203._28_36_ = auVar137._28_36_;
        auVar203._24_4_ = fVar142 * 0.0;
        auVar151 = vsubps_avx(auVar56,auVar203._0_32_);
        local_7a0._0_4_ = auVar104._0_4_;
        local_7a0._4_4_ = auVar104._4_4_;
        auStack_798._0_4_ = auVar104._8_4_;
        auStack_798._4_4_ = auVar104._12_4_;
        fStack_790 = auVar104._16_4_;
        fStack_78c = auVar104._20_4_;
        fStack_788 = auVar104._24_4_;
        auVar175._0_4_ = (float)local_100 * (float)local_7a0._0_4_;
        auVar175._4_4_ = local_100._4_4_ * (float)local_7a0._4_4_;
        auVar175._8_4_ = (float)uStack_f8 * (float)auStack_798._0_4_;
        auVar175._12_4_ = uStack_f8._4_4_ * (float)auStack_798._4_4_;
        auVar175._16_4_ = (float)uStack_f0 * fStack_790;
        auVar175._20_4_ = uStack_f0._4_4_ * fStack_78c;
        auVar175._24_4_ = (float)uStack_e8 * fStack_788;
        auVar175._28_4_ = 0;
        auVar24 = vfmadd231ps_fma(auVar175,auVar195,local_e0);
        auVar24 = vfmadd231ps_fma(ZEXT1632(auVar24),local_c0,local_760);
        auVar24 = vfmadd231ps_fma(ZEXT1632(auVar24),local_a0,auVar135);
        auVar57._4_4_ = fVar205 * local_100._4_4_;
        auVar57._0_4_ = fVar23 * (float)local_100;
        auVar57._8_4_ = fVar207 * (float)uStack_f8;
        auVar57._12_4_ = fVar84 * uStack_f8._4_4_;
        auVar57._16_4_ = fVar85 * (float)uStack_f0;
        auVar57._20_4_ = fVar86 * uStack_f0._4_4_;
        auVar57._24_4_ = fVar87 * (float)uStack_e8;
        auVar57._28_4_ = uStack_e8._4_4_;
        auVar10 = vfmadd231ps_fma(auVar57,auVar154,local_e0);
        auVar10 = vfmadd231ps_fma(ZEXT1632(auVar10),auVar152,local_c0);
        auVar10 = vfmadd231ps_fma(ZEXT1632(auVar10),auVar133,local_a0);
        auVar58._4_4_ = fVar125 * fVar125;
        auVar58._0_4_ = fVar143 * fVar143;
        auVar58._8_4_ = fVar138 * fVar138;
        auVar58._12_4_ = fVar139 * fVar139;
        auVar58._16_4_ = fVar140 * fVar140;
        auVar58._20_4_ = fVar141 * fVar141;
        auVar58._24_4_ = fVar142 * fVar142;
        auVar58._28_4_ = local_a0._28_4_;
        auVar11 = vfmadd231ps_fma(auVar58,local_320,local_320);
        auVar120 = vmaxps_avx(ZEXT1632(auVar24),ZEXT1632(auVar10));
        auVar190._0_4_ = auVar120._0_4_ * auVar120._0_4_ * auVar11._0_4_;
        auVar190._4_4_ = auVar120._4_4_ * auVar120._4_4_ * auVar11._4_4_;
        auVar190._8_4_ = auVar120._8_4_ * auVar120._8_4_ * auVar11._8_4_;
        auVar190._12_4_ = auVar120._12_4_ * auVar120._12_4_ * auVar11._12_4_;
        auVar190._16_4_ = auVar120._16_4_ * auVar120._16_4_ * 0.0;
        auVar190._20_4_ = auVar120._20_4_ * auVar120._20_4_ * 0.0;
        auVar190._24_4_ = auVar120._24_4_ * auVar120._24_4_ * 0.0;
        auVar190._28_4_ = 0;
        auVar59._4_4_ = auVar151._4_4_ * auVar151._4_4_;
        auVar59._0_4_ = auVar151._0_4_ * auVar151._0_4_;
        auVar59._8_4_ = auVar151._8_4_ * auVar151._8_4_;
        auVar59._12_4_ = auVar151._12_4_ * auVar151._12_4_;
        auVar59._16_4_ = auVar151._16_4_ * auVar151._16_4_;
        auVar59._20_4_ = auVar151._20_4_ * auVar151._20_4_;
        auVar59._24_4_ = auVar151._24_4_ * auVar151._24_4_;
        auVar59._28_4_ = auVar151._28_4_;
        auVar120 = vcmpps_avx(auVar59,auVar190,2);
        local_260 = (int)lVar108;
        auVar191._4_4_ = local_260;
        auVar191._0_4_ = local_260;
        auVar191._8_4_ = local_260;
        auVar191._12_4_ = local_260;
        auVar191._16_4_ = local_260;
        auVar191._20_4_ = local_260;
        auVar191._24_4_ = local_260;
        auVar191._28_4_ = local_260;
        auVar151 = vpor_avx2(auVar191,_DAT_01fb4ba0);
        auVar124 = vpcmpgtd_avx2(local_380,auVar151);
        auVar151 = auVar124 & auVar120;
        if ((((((((auVar151 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar151 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar151 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar151 >> 0x7f,0) != '\0') ||
              (auVar151 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar151 >> 0xbf,0) != '\0') ||
            (auVar151 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar151[0x1f] < '\0') {
          local_3e0 = vandps_avx(auVar124,auVar120);
          auVar60._4_4_ = fVar205 * local_560._4_4_;
          auVar60._0_4_ = fVar23 * (float)local_560;
          auVar60._8_4_ = fVar207 * (float)uStack_558;
          auVar60._12_4_ = fVar84 * uStack_558._4_4_;
          auVar60._16_4_ = fVar85 * (float)uStack_550;
          auVar60._20_4_ = fVar86 * uStack_550._4_4_;
          auVar60._24_4_ = fVar87 * (float)uStack_548;
          auVar60._28_4_ = auVar120._28_4_;
          auVar11 = vfmadd213ps_fma(auVar154,local_300,auVar60);
          auVar11 = vfmadd213ps_fma(auVar152,local_120,ZEXT1632(auVar11));
          auVar11 = vfmadd132ps_fma(auVar133,ZEXT1632(auVar11),local_400);
          auVar61._4_4_ = local_560._4_4_ * (float)local_7a0._4_4_;
          auVar61._0_4_ = (float)local_560 * (float)local_7a0._0_4_;
          auVar61._8_4_ = (float)uStack_558 * (float)auStack_798._0_4_;
          auVar61._12_4_ = uStack_558._4_4_ * (float)auStack_798._4_4_;
          auVar61._16_4_ = (float)uStack_550 * fStack_790;
          auVar61._20_4_ = uStack_550._4_4_ * fStack_78c;
          auVar61._24_4_ = (float)uStack_548 * fStack_788;
          auVar61._28_4_ = auVar120._28_4_;
          auVar12 = vfmadd213ps_fma(auVar195,local_300,auVar61);
          auVar12 = vfmadd213ps_fma(local_760,local_120,ZEXT1632(auVar12));
          auVar195 = *(undefined1 (*) [32])(lVar110 + 0x21fc4f4 + lVar108 * 4);
          auVar133 = *(undefined1 (*) [32])(lVar110 + 0x21fc978 + lVar108 * 4);
          auVar152 = *(undefined1 (*) [32])(lVar110 + 0x21fcdfc + lVar108 * 4);
          pfVar6 = (float *)(lVar110 + 0x21fd280 + lVar108 * 4);
          fVar143 = *pfVar6;
          fVar125 = pfVar6[1];
          fVar138 = pfVar6[2];
          fVar139 = pfVar6[3];
          fVar140 = pfVar6[4];
          fVar141 = pfVar6[5];
          fVar142 = pfVar6[6];
          auVar183._0_4_ = local_580 * fVar143;
          auVar183._4_4_ = fStack_57c * fVar125;
          auVar183._8_4_ = fStack_578 * fVar138;
          auVar183._12_4_ = fStack_574 * fVar139;
          auVar183._16_4_ = fStack_570 * fVar140;
          auVar183._20_4_ = fStack_56c * fVar141;
          auVar183._24_4_ = fStack_568 * fVar142;
          auVar183._28_4_ = 0;
          auVar201._0_4_ = local_5a0 * fVar143;
          auVar201._4_4_ = fStack_59c * fVar125;
          auVar201._8_4_ = fStack_598 * fVar138;
          auVar201._12_4_ = fStack_594 * fVar139;
          auVar201._16_4_ = fStack_590 * fVar140;
          auVar201._20_4_ = fStack_58c * fVar141;
          auVar201._24_4_ = fStack_588 * fVar142;
          auVar201._28_4_ = 0;
          auVar62._4_4_ = fVar125 * local_560._4_4_;
          auVar62._0_4_ = fVar143 * (float)local_560;
          auVar62._8_4_ = fVar138 * (float)uStack_558;
          auVar62._12_4_ = fVar139 * uStack_558._4_4_;
          auVar62._16_4_ = fVar140 * (float)uStack_550;
          auVar62._20_4_ = fVar141 * uStack_550._4_4_;
          auVar62._24_4_ = fVar142 * (float)uStack_548;
          auVar62._28_4_ = pfVar6[7];
          auVar13 = vfmadd231ps_fma(auVar183,auVar152,local_6c0);
          auVar14 = vfmadd231ps_fma(auVar201,auVar152,local_5c0);
          auVar15 = vfmadd231ps_fma(auVar62,local_300,auVar152);
          auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar133,local_640);
          auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar133,local_660);
          auVar15 = vfmadd231ps_fma(ZEXT1632(auVar15),local_120,auVar133);
          auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar195,local_520);
          auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar195,local_480);
          auVar15 = vfmadd231ps_fma(ZEXT1632(auVar15),auVar195,local_400);
          pfVar6 = (float *)(lVar110 + 0x21ff6a0 + lVar108 * 4);
          fVar143 = *pfVar6;
          fVar125 = pfVar6[1];
          fVar138 = pfVar6[2];
          fVar139 = pfVar6[3];
          fVar140 = pfVar6[4];
          fVar141 = pfVar6[5];
          fVar142 = pfVar6[6];
          auVar63._4_4_ = fStack_57c * fVar125;
          auVar63._0_4_ = local_580 * fVar143;
          auVar63._8_4_ = fStack_578 * fVar138;
          auVar63._12_4_ = fStack_574 * fVar139;
          auVar63._16_4_ = fStack_570 * fVar140;
          auVar63._20_4_ = fStack_56c * fVar141;
          auVar63._24_4_ = fStack_568 * fVar142;
          auVar63._28_4_ = fStack_564;
          auVar64._4_4_ = fStack_59c * fVar125;
          auVar64._0_4_ = local_5a0 * fVar143;
          auVar64._8_4_ = fStack_598 * fVar138;
          auVar64._12_4_ = fStack_594 * fVar139;
          auVar64._16_4_ = fStack_590 * fVar140;
          auVar64._20_4_ = fStack_58c * fVar141;
          auVar64._24_4_ = fStack_588 * fVar142;
          auVar64._28_4_ = fStack_584;
          auVar65._4_4_ = fVar125 * local_560._4_4_;
          auVar65._0_4_ = fVar143 * (float)local_560;
          auVar65._8_4_ = fVar138 * (float)uStack_558;
          auVar65._12_4_ = fVar139 * uStack_558._4_4_;
          auVar65._16_4_ = fVar140 * (float)uStack_550;
          auVar65._20_4_ = fVar141 * uStack_550._4_4_;
          auVar65._24_4_ = fVar142 * (float)uStack_548;
          auVar65._28_4_ = pfVar6[7];
          auVar195 = *(undefined1 (*) [32])(lVar110 + 0x21ff21c + lVar108 * 4);
          auVar16 = vfmadd231ps_fma(auVar63,auVar195,local_6c0);
          auVar17 = vfmadd231ps_fma(auVar64,auVar195,local_5c0);
          auVar115 = vfmadd231ps_fma(auVar65,local_300,auVar195);
          auVar195 = *(undefined1 (*) [32])(lVar110 + 0x21fed98 + lVar108 * 4);
          auVar16 = vfmadd231ps_fma(ZEXT1632(auVar16),auVar195,local_640);
          auVar17 = vfmadd231ps_fma(ZEXT1632(auVar17),auVar195,local_660);
          auVar115 = vfmadd231ps_fma(ZEXT1632(auVar115),local_120,auVar195);
          auVar195 = *(undefined1 (*) [32])(lVar110 + 0x21fe914 + lVar108 * 4);
          auVar16 = vfmadd231ps_fma(ZEXT1632(auVar16),auVar195,local_520);
          auVar17 = vfmadd231ps_fma(ZEXT1632(auVar17),auVar195,local_480);
          auVar115 = vfmadd231ps_fma(ZEXT1632(auVar115),local_400,auVar195);
          auVar195 = vandps_avx(ZEXT1632(auVar13),local_2e0);
          auVar133 = vandps_avx(ZEXT1632(auVar14),local_2e0);
          auVar133 = vmaxps_avx(auVar195,auVar133);
          auVar195 = vandps_avx(ZEXT1632(auVar15),local_2e0);
          auVar195 = vmaxps_avx(auVar133,auVar195);
          auVar103._4_4_ = uStack_13c;
          auVar103._0_4_ = local_140;
          auVar103._8_4_ = uStack_138;
          auVar103._12_4_ = uStack_134;
          auVar103._16_4_ = uStack_130;
          auVar103._20_4_ = uStack_12c;
          auVar103._24_4_ = uStack_128;
          auVar103._28_4_ = uStack_124;
          auVar195 = vcmpps_avx(auVar195,auVar103,1);
          auVar152 = vblendvps_avx(ZEXT1632(auVar13),local_320,auVar195);
          auVar154 = vblendvps_avx(ZEXT1632(auVar14),local_360,auVar195);
          auVar195 = vandps_avx(ZEXT1632(auVar16),local_2e0);
          auVar133 = vandps_avx(ZEXT1632(auVar17),local_2e0);
          auVar133 = vmaxps_avx(auVar195,auVar133);
          auVar195 = vandps_avx(local_2e0,ZEXT1632(auVar115));
          auVar195 = vmaxps_avx(auVar133,auVar195);
          auVar133 = vcmpps_avx(auVar195,auVar103,1);
          auVar195 = vblendvps_avx(ZEXT1632(auVar16),local_320,auVar133);
          auVar133 = vblendvps_avx(ZEXT1632(auVar17),local_360,auVar133);
          auVar12 = vfmadd213ps_fma(auVar135,local_400,ZEXT1632(auVar12));
          auVar13 = vfmadd213ps_fma(auVar152,auVar152,ZEXT832(0) << 0x20);
          auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar154,auVar154);
          auVar135 = vrsqrtps_avx(ZEXT1632(auVar13));
          fVar143 = auVar135._0_4_;
          fVar125 = auVar135._4_4_;
          fVar138 = auVar135._8_4_;
          fVar139 = auVar135._12_4_;
          fVar140 = auVar135._16_4_;
          fVar141 = auVar135._20_4_;
          fVar142 = auVar135._24_4_;
          auVar66._4_4_ = fVar125 * fVar125 * fVar125 * auVar13._4_4_ * -0.5;
          auVar66._0_4_ = fVar143 * fVar143 * fVar143 * auVar13._0_4_ * -0.5;
          auVar66._8_4_ = fVar138 * fVar138 * fVar138 * auVar13._8_4_ * -0.5;
          auVar66._12_4_ = fVar139 * fVar139 * fVar139 * auVar13._12_4_ * -0.5;
          auVar66._16_4_ = fVar140 * fVar140 * fVar140 * -0.0;
          auVar66._20_4_ = fVar141 * fVar141 * fVar141 * -0.0;
          auVar66._24_4_ = fVar142 * fVar142 * fVar142 * -0.0;
          auVar66._28_4_ = 0;
          auVar212._8_4_ = 0x3fc00000;
          auVar212._0_8_ = 0x3fc000003fc00000;
          auVar212._12_4_ = 0x3fc00000;
          auVar212._16_4_ = 0x3fc00000;
          auVar212._20_4_ = 0x3fc00000;
          auVar212._24_4_ = 0x3fc00000;
          auVar212._28_4_ = 0x3fc00000;
          auVar13 = vfmadd231ps_fma(auVar66,auVar212,auVar135);
          fVar143 = auVar13._0_4_;
          fVar125 = auVar13._4_4_;
          auVar67._4_4_ = auVar154._4_4_ * fVar125;
          auVar67._0_4_ = auVar154._0_4_ * fVar143;
          fVar138 = auVar13._8_4_;
          auVar67._8_4_ = auVar154._8_4_ * fVar138;
          fVar139 = auVar13._12_4_;
          auVar67._12_4_ = auVar154._12_4_ * fVar139;
          auVar67._16_4_ = auVar154._16_4_ * 0.0;
          auVar67._20_4_ = auVar154._20_4_ * 0.0;
          auVar67._24_4_ = auVar154._24_4_ * 0.0;
          auVar67._28_4_ = auVar154._28_4_;
          auVar68._4_4_ = fVar125 * -auVar152._4_4_;
          auVar68._0_4_ = fVar143 * -auVar152._0_4_;
          auVar68._8_4_ = fVar138 * -auVar152._8_4_;
          auVar68._12_4_ = fVar139 * -auVar152._12_4_;
          auVar68._16_4_ = -auVar152._16_4_ * 0.0;
          auVar68._20_4_ = -auVar152._20_4_ * 0.0;
          auVar68._24_4_ = -auVar152._24_4_ * 0.0;
          auVar68._28_4_ = auVar135._28_4_;
          auVar13 = vfmadd213ps_fma(auVar195,auVar195,ZEXT832(0) << 0x20);
          auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar133,auVar133);
          auVar135 = vrsqrtps_avx(ZEXT1632(auVar13));
          auVar69._28_4_ = local_360._28_4_;
          auVar69._0_28_ =
               ZEXT1628(CONCAT412(fVar139 * 0.0,
                                  CONCAT48(fVar138 * 0.0,CONCAT44(fVar125 * 0.0,fVar143 * 0.0))));
          fVar143 = auVar135._0_4_;
          fVar125 = auVar135._4_4_;
          fVar138 = auVar135._8_4_;
          fVar139 = auVar135._12_4_;
          fVar140 = auVar135._16_4_;
          fVar141 = auVar135._20_4_;
          fVar142 = auVar135._24_4_;
          auVar70._4_4_ = fVar125 * fVar125 * fVar125 * auVar13._4_4_ * -0.5;
          auVar70._0_4_ = fVar143 * fVar143 * fVar143 * auVar13._0_4_ * -0.5;
          auVar70._8_4_ = fVar138 * fVar138 * fVar138 * auVar13._8_4_ * -0.5;
          auVar70._12_4_ = fVar139 * fVar139 * fVar139 * auVar13._12_4_ * -0.5;
          auVar70._16_4_ = fVar140 * fVar140 * fVar140 * -0.0;
          auVar70._20_4_ = fVar141 * fVar141 * fVar141 * -0.0;
          auVar70._24_4_ = fVar142 * fVar142 * fVar142 * -0.0;
          auVar70._28_4_ = 0;
          auVar13 = vfmadd231ps_fma(auVar70,auVar212,auVar135);
          fVar143 = auVar13._0_4_;
          fVar125 = auVar13._4_4_;
          auVar71._4_4_ = auVar133._4_4_ * fVar125;
          auVar71._0_4_ = auVar133._0_4_ * fVar143;
          fVar138 = auVar13._8_4_;
          auVar71._8_4_ = auVar133._8_4_ * fVar138;
          fVar139 = auVar13._12_4_;
          auVar71._12_4_ = auVar133._12_4_ * fVar139;
          auVar71._16_4_ = auVar133._16_4_ * 0.0;
          auVar71._20_4_ = auVar133._20_4_ * 0.0;
          auVar71._24_4_ = auVar133._24_4_ * 0.0;
          auVar71._28_4_ = 0;
          auVar72._4_4_ = fVar125 * -auVar195._4_4_;
          auVar72._0_4_ = fVar143 * -auVar195._0_4_;
          auVar72._8_4_ = fVar138 * -auVar195._8_4_;
          auVar72._12_4_ = fVar139 * -auVar195._12_4_;
          auVar72._16_4_ = -auVar195._16_4_ * 0.0;
          auVar72._20_4_ = -auVar195._20_4_ * 0.0;
          auVar72._24_4_ = -auVar195._24_4_ * 0.0;
          auVar72._28_4_ = auVar135._28_4_;
          auVar73._28_4_ = 0xbf000000;
          auVar73._0_28_ =
               ZEXT1628(CONCAT412(fVar139 * 0.0,
                                  CONCAT48(fVar138 * 0.0,CONCAT44(fVar125 * 0.0,fVar143 * 0.0))));
          auVar13 = vfmadd213ps_fma(auVar67,ZEXT1632(auVar24),_local_460);
          auVar135 = ZEXT1632(auVar24);
          auVar14 = vfmadd213ps_fma(auVar68,auVar135,local_420);
          auVar15 = vfmadd213ps_fma(auVar69,auVar135,ZEXT1632(auVar12));
          auVar115 = vfnmadd213ps_fma(auVar67,auVar135,_local_460);
          auVar16 = vfmadd213ps_fma(auVar71,ZEXT1632(auVar10),local_340);
          auVar163 = vfnmadd213ps_fma(auVar68,auVar135,local_420);
          auVar135 = ZEXT1632(auVar10);
          auVar17 = vfmadd213ps_fma(auVar72,auVar135,local_440);
          local_760 = ZEXT1632(auVar24);
          auVar24 = vfnmadd231ps_fma(ZEXT1632(auVar12),local_760,auVar69);
          auVar12 = vfmadd213ps_fma(auVar73,auVar135,ZEXT1632(auVar11));
          auVar26 = vfnmadd213ps_fma(auVar71,auVar135,local_340);
          auVar27 = vfnmadd213ps_fma(auVar72,auVar135,local_440);
          auVar126 = vfnmadd231ps_fma(ZEXT1632(auVar11),ZEXT1632(auVar10),auVar73);
          local_540 = ZEXT1632(auVar126);
          auVar135 = vsubps_avx(ZEXT1632(auVar17),ZEXT1632(auVar163));
          auVar195 = vsubps_avx(ZEXT1632(auVar12),ZEXT1632(auVar24));
          auVar176._0_4_ = auVar135._0_4_ * auVar24._0_4_;
          auVar176._4_4_ = auVar135._4_4_ * auVar24._4_4_;
          auVar176._8_4_ = auVar135._8_4_ * auVar24._8_4_;
          auVar176._12_4_ = auVar135._12_4_ * auVar24._12_4_;
          auVar176._16_4_ = auVar135._16_4_ * 0.0;
          auVar176._20_4_ = auVar135._20_4_ * 0.0;
          auVar176._24_4_ = auVar135._24_4_ * 0.0;
          auVar176._28_4_ = 0;
          auVar11 = vfmsub231ps_fma(auVar176,ZEXT1632(auVar163),auVar195);
          auVar74._4_4_ = auVar115._4_4_ * auVar195._4_4_;
          auVar74._0_4_ = auVar115._0_4_ * auVar195._0_4_;
          auVar74._8_4_ = auVar115._8_4_ * auVar195._8_4_;
          auVar74._12_4_ = auVar115._12_4_ * auVar195._12_4_;
          auVar74._16_4_ = auVar195._16_4_ * 0.0;
          auVar74._20_4_ = auVar195._20_4_ * 0.0;
          auVar74._24_4_ = auVar195._24_4_ * 0.0;
          auVar74._28_4_ = auVar195._28_4_;
          auVar120 = ZEXT1632(auVar115);
          auVar195 = vsubps_avx(ZEXT1632(auVar16),auVar120);
          auVar124 = ZEXT1632(auVar24);
          auVar24 = vfmsub231ps_fma(auVar74,auVar124,auVar195);
          auVar75._4_4_ = auVar163._4_4_ * auVar195._4_4_;
          auVar75._0_4_ = auVar163._0_4_ * auVar195._0_4_;
          auVar75._8_4_ = auVar163._8_4_ * auVar195._8_4_;
          auVar75._12_4_ = auVar163._12_4_ * auVar195._12_4_;
          auVar75._16_4_ = auVar195._16_4_ * 0.0;
          auVar75._20_4_ = auVar195._20_4_ * 0.0;
          auVar75._24_4_ = auVar195._24_4_ * 0.0;
          auVar75._28_4_ = auVar195._28_4_;
          auVar115 = vfmsub231ps_fma(auVar75,auVar120,auVar135);
          auVar24 = vfmadd231ps_fma(ZEXT1632(auVar115),ZEXT832(0) << 0x20,ZEXT1632(auVar24));
          auVar24 = vfmadd231ps_fma(ZEXT1632(auVar24),ZEXT832(0) << 0x20,ZEXT1632(auVar11));
          auVar22 = vcmpps_avx(ZEXT1632(auVar24),ZEXT832(0) << 0x20,2);
          auVar135 = vblendvps_avx(ZEXT1632(auVar26),ZEXT1632(auVar13),auVar22);
          local_680 = vblendvps_avx(ZEXT1632(auVar27),ZEXT1632(auVar14),auVar22);
          auVar195 = vblendvps_avx(local_540,ZEXT1632(auVar15),auVar22);
          auVar133 = vblendvps_avx(auVar120,ZEXT1632(auVar16),auVar22);
          auVar152 = vblendvps_avx(ZEXT1632(auVar163),ZEXT1632(auVar17),auVar22);
          auVar154 = vblendvps_avx(auVar124,ZEXT1632(auVar12),auVar22);
          auVar120 = vblendvps_avx(ZEXT1632(auVar16),auVar120,auVar22);
          auVar151 = vblendvps_avx(ZEXT1632(auVar17),ZEXT1632(auVar163),auVar22);
          auVar24 = vpackssdw_avx(local_3e0._0_16_,local_3e0._16_16_);
          local_780 = ZEXT1632(auVar24);
          auVar124 = vblendvps_avx(ZEXT1632(auVar12),auVar124,auVar22);
          auVar120 = vsubps_avx(auVar120,auVar135);
          auVar151 = vsubps_avx(auVar151,local_680);
          auVar127 = vsubps_avx(auVar124,auVar195);
          auVar149 = vsubps_avx(auVar135,auVar133);
          auVar161 = vsubps_avx(local_680,auVar152);
          auVar168 = vsubps_avx(auVar195,auVar154);
          auVar169._0_4_ = auVar127._0_4_ * auVar135._0_4_;
          auVar169._4_4_ = auVar127._4_4_ * auVar135._4_4_;
          auVar169._8_4_ = auVar127._8_4_ * auVar135._8_4_;
          auVar169._12_4_ = auVar127._12_4_ * auVar135._12_4_;
          auVar169._16_4_ = auVar127._16_4_ * auVar135._16_4_;
          auVar169._20_4_ = auVar127._20_4_ * auVar135._20_4_;
          auVar169._24_4_ = auVar127._24_4_ * auVar135._24_4_;
          auVar169._28_4_ = 0;
          auVar11 = vfmsub231ps_fma(auVar169,auVar195,auVar120);
          auVar76._4_4_ = auVar120._4_4_ * local_680._4_4_;
          auVar76._0_4_ = auVar120._0_4_ * local_680._0_4_;
          auVar76._8_4_ = auVar120._8_4_ * local_680._8_4_;
          auVar76._12_4_ = auVar120._12_4_ * local_680._12_4_;
          auVar76._16_4_ = auVar120._16_4_ * local_680._16_4_;
          auVar76._20_4_ = auVar120._20_4_ * local_680._20_4_;
          auVar76._24_4_ = auVar120._24_4_ * local_680._24_4_;
          auVar76._28_4_ = auVar124._28_4_;
          auVar12 = vfmsub231ps_fma(auVar76,auVar135,auVar151);
          auVar11 = vfmadd231ps_fma(ZEXT1632(auVar12),ZEXT832(0) << 0x20,ZEXT1632(auVar11));
          auVar170._0_4_ = auVar151._0_4_ * auVar195._0_4_;
          auVar170._4_4_ = auVar151._4_4_ * auVar195._4_4_;
          auVar170._8_4_ = auVar151._8_4_ * auVar195._8_4_;
          auVar170._12_4_ = auVar151._12_4_ * auVar195._12_4_;
          auVar170._16_4_ = auVar151._16_4_ * auVar195._16_4_;
          auVar170._20_4_ = auVar151._20_4_ * auVar195._20_4_;
          auVar170._24_4_ = auVar151._24_4_ * auVar195._24_4_;
          auVar170._28_4_ = 0;
          auVar12 = vfmsub231ps_fma(auVar170,local_680,auVar127);
          auVar12 = vfmadd231ps_fma(ZEXT1632(auVar11),ZEXT832(0) << 0x20,ZEXT1632(auVar12));
          auVar171._0_4_ = auVar168._0_4_ * auVar133._0_4_;
          auVar171._4_4_ = auVar168._4_4_ * auVar133._4_4_;
          auVar171._8_4_ = auVar168._8_4_ * auVar133._8_4_;
          auVar171._12_4_ = auVar168._12_4_ * auVar133._12_4_;
          auVar171._16_4_ = auVar168._16_4_ * auVar133._16_4_;
          auVar171._20_4_ = auVar168._20_4_ * auVar133._20_4_;
          auVar171._24_4_ = auVar168._24_4_ * auVar133._24_4_;
          auVar171._28_4_ = 0;
          auVar11 = vfmsub231ps_fma(auVar171,auVar149,auVar154);
          auVar77._4_4_ = auVar161._4_4_ * auVar154._4_4_;
          auVar77._0_4_ = auVar161._0_4_ * auVar154._0_4_;
          auVar77._8_4_ = auVar161._8_4_ * auVar154._8_4_;
          auVar77._12_4_ = auVar161._12_4_ * auVar154._12_4_;
          auVar77._16_4_ = auVar161._16_4_ * auVar154._16_4_;
          auVar77._20_4_ = auVar161._20_4_ * auVar154._20_4_;
          auVar77._24_4_ = auVar161._24_4_ * auVar154._24_4_;
          auVar77._28_4_ = auVar154._28_4_;
          auVar13 = vfmsub231ps_fma(auVar77,auVar152,auVar168);
          auVar78._4_4_ = auVar149._4_4_ * auVar152._4_4_;
          auVar78._0_4_ = auVar149._0_4_ * auVar152._0_4_;
          auVar78._8_4_ = auVar149._8_4_ * auVar152._8_4_;
          auVar78._12_4_ = auVar149._12_4_ * auVar152._12_4_;
          auVar78._16_4_ = auVar149._16_4_ * auVar152._16_4_;
          auVar78._20_4_ = auVar149._20_4_ * auVar152._20_4_;
          auVar78._24_4_ = auVar149._24_4_ * auVar152._24_4_;
          auVar78._28_4_ = auVar152._28_4_;
          auVar14 = vfmsub231ps_fma(auVar78,auVar161,auVar133);
          auVar11 = vfmadd231ps_fma(ZEXT1632(auVar14),ZEXT832(0) << 0x20,ZEXT1632(auVar11));
          auVar13 = vfmadd231ps_fma(ZEXT1632(auVar11),ZEXT832(0) << 0x20,ZEXT1632(auVar13));
          auVar133 = vmaxps_avx(ZEXT1632(auVar12),ZEXT1632(auVar13));
          auVar133 = vcmpps_avx(auVar133,ZEXT832(0) << 0x20,2);
          auVar11 = vpackssdw_avx(auVar133._0_16_,auVar133._16_16_);
          auVar24 = vpand_avx(auVar11,auVar24);
          auVar133 = vpmovsxwd_avx2(auVar24);
          if ((((((((auVar133 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar133 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar133 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar133 >> 0x7f,0) == '\0') &&
                (auVar133 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar133 >> 0xbf,0) == '\0') &&
              (auVar133 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar133[0x1f]) {
LAB_01376a79:
            auVar159._8_8_ = uStack_498;
            auVar159._0_8_ = local_4a0;
            auVar159._16_8_ = uStack_490;
            auVar159._24_8_ = uStack_488;
            auVar194 = ZEXT3264(auVar194._0_32_);
            auVar192 = ZEXT3264(auVar189);
          }
          else {
            auVar79._4_4_ = auVar151._4_4_ * auVar168._4_4_;
            auVar79._0_4_ = auVar151._0_4_ * auVar168._0_4_;
            auVar79._8_4_ = auVar151._8_4_ * auVar168._8_4_;
            auVar79._12_4_ = auVar151._12_4_ * auVar168._12_4_;
            auVar79._16_4_ = auVar151._16_4_ * auVar168._16_4_;
            auVar79._20_4_ = auVar151._20_4_ * auVar168._20_4_;
            auVar79._24_4_ = auVar151._24_4_ * auVar168._24_4_;
            auVar79._28_4_ = auVar133._28_4_;
            auVar16 = vfmsub231ps_fma(auVar79,auVar161,auVar127);
            auVar177._0_4_ = auVar149._0_4_ * auVar127._0_4_;
            auVar177._4_4_ = auVar149._4_4_ * auVar127._4_4_;
            auVar177._8_4_ = auVar149._8_4_ * auVar127._8_4_;
            auVar177._12_4_ = auVar149._12_4_ * auVar127._12_4_;
            auVar177._16_4_ = auVar149._16_4_ * auVar127._16_4_;
            auVar177._20_4_ = auVar149._20_4_ * auVar127._20_4_;
            auVar177._24_4_ = auVar149._24_4_ * auVar127._24_4_;
            auVar177._28_4_ = 0;
            auVar15 = vfmsub231ps_fma(auVar177,auVar120,auVar168);
            auVar80._4_4_ = auVar120._4_4_ * auVar161._4_4_;
            auVar80._0_4_ = auVar120._0_4_ * auVar161._0_4_;
            auVar80._8_4_ = auVar120._8_4_ * auVar161._8_4_;
            auVar80._12_4_ = auVar120._12_4_ * auVar161._12_4_;
            auVar80._16_4_ = auVar120._16_4_ * auVar161._16_4_;
            auVar80._20_4_ = auVar120._20_4_ * auVar161._20_4_;
            auVar80._24_4_ = auVar120._24_4_ * auVar161._24_4_;
            auVar80._28_4_ = auVar161._28_4_;
            auVar17 = vfmsub231ps_fma(auVar80,auVar149,auVar151);
            auVar11 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar15),ZEXT1632(auVar17));
            auVar14 = vfmadd231ps_fma(ZEXT1632(auVar11),ZEXT1632(auVar16),ZEXT832(0) << 0x20);
            auVar133 = vrcpps_avx(ZEXT1632(auVar14));
            auVar202._8_4_ = 0x3f800000;
            auVar202._0_8_ = 0x3f8000003f800000;
            auVar202._12_4_ = 0x3f800000;
            auVar202._16_4_ = 0x3f800000;
            auVar202._20_4_ = 0x3f800000;
            auVar202._24_4_ = 0x3f800000;
            auVar202._28_4_ = 0x3f800000;
            auVar11 = vfnmadd213ps_fma(auVar133,ZEXT1632(auVar14),auVar202);
            auVar11 = vfmadd132ps_fma(ZEXT1632(auVar11),auVar133,auVar133);
            auVar81._4_4_ = auVar17._4_4_ * auVar195._4_4_;
            auVar81._0_4_ = auVar17._0_4_ * auVar195._0_4_;
            auVar81._8_4_ = auVar17._8_4_ * auVar195._8_4_;
            auVar81._12_4_ = auVar17._12_4_ * auVar195._12_4_;
            auVar81._16_4_ = auVar195._16_4_ * 0.0;
            auVar81._20_4_ = auVar195._20_4_ * 0.0;
            auVar81._24_4_ = auVar195._24_4_ * 0.0;
            auVar81._28_4_ = auVar195._28_4_;
            auVar15 = vfmadd231ps_fma(auVar81,ZEXT1632(auVar15),local_680);
            auVar15 = vfmadd231ps_fma(ZEXT1632(auVar15),ZEXT1632(auVar16),auVar135);
            fVar125 = auVar11._0_4_;
            fVar138 = auVar11._4_4_;
            fVar139 = auVar11._8_4_;
            fVar140 = auVar11._12_4_;
            auVar152 = ZEXT1632(CONCAT412(fVar140 * auVar15._12_4_,
                                          CONCAT48(fVar139 * auVar15._8_4_,
                                                   CONCAT44(fVar138 * auVar15._4_4_,
                                                            fVar125 * auVar15._0_4_))));
            fVar143 = ray->tfar;
            auVar158._4_4_ = fVar143;
            auVar158._0_4_ = fVar143;
            auVar158._8_4_ = fVar143;
            auVar158._12_4_ = fVar143;
            auVar158._16_4_ = fVar143;
            auVar158._20_4_ = fVar143;
            auVar158._24_4_ = fVar143;
            auVar158._28_4_ = fVar143;
            auVar102._8_8_ = uStack_158;
            auVar102._0_8_ = local_160;
            auVar102._16_8_ = uStack_150;
            auVar102._24_8_ = uStack_148;
            auVar195 = vcmpps_avx(auVar102,auVar152,2);
            auVar133 = vcmpps_avx(auVar152,auVar158,2);
            auVar195 = vandps_avx(auVar133,auVar195);
            auVar11 = vpackssdw_avx(auVar195._0_16_,auVar195._16_16_);
            auVar24 = vpand_avx(auVar24,auVar11);
            auVar195 = vpmovsxwd_avx2(auVar24);
            if ((((((((auVar195 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar195 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar195 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar195 >> 0x7f,0) == '\0') &&
                  (auVar195 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar195 >> 0xbf,0) == '\0') &&
                (auVar195 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar195[0x1f]) goto LAB_01376a79;
            auVar195 = vcmpps_avx(ZEXT1632(auVar14),ZEXT832(0) << 0x20,4);
            auVar11 = vpackssdw_avx(auVar195._0_16_,auVar195._16_16_);
            auVar24 = vpand_avx(auVar24,auVar11);
            auVar195 = vpmovsxwd_avx2(auVar24);
            auVar159._8_8_ = uStack_498;
            auVar159._0_8_ = local_4a0;
            auVar159._16_8_ = uStack_490;
            auVar159._24_8_ = uStack_488;
            auVar194 = ZEXT3264(auVar194._0_32_);
            auVar192 = ZEXT3264(auVar189);
            if ((((((((auVar195 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar195 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar195 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar195 >> 0x7f,0) != '\0') ||
                  (auVar195 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar195 >> 0xbf,0) != '\0') ||
                (auVar195 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar195[0x1f] < '\0') {
              auVar154 = ZEXT1632(CONCAT412(fVar140 * auVar12._12_4_,
                                            CONCAT48(fVar139 * auVar12._8_4_,
                                                     CONCAT44(fVar138 * auVar12._4_4_,
                                                              fVar125 * auVar12._0_4_))));
              auVar82._28_4_ = SUB84(uStack_488,4);
              auVar82._0_28_ =
                   ZEXT1628(CONCAT412(fVar140 * auVar13._12_4_,
                                      CONCAT48(fVar139 * auVar13._8_4_,
                                               CONCAT44(fVar138 * auVar13._4_4_,
                                                        fVar125 * auVar13._0_4_))));
              auVar184._8_4_ = 0x3f800000;
              auVar184._0_8_ = 0x3f8000003f800000;
              auVar184._12_4_ = 0x3f800000;
              auVar184._16_4_ = 0x3f800000;
              auVar184._20_4_ = 0x3f800000;
              auVar184._24_4_ = 0x3f800000;
              auVar184._28_4_ = 0x3f800000;
              auVar133 = vsubps_avx(auVar184,auVar154);
              auVar133 = vblendvps_avx(auVar133,auVar154,auVar22);
              auVar194 = ZEXT3264(auVar133);
              auVar133 = vsubps_avx(auVar184,auVar82);
              local_3c0 = vblendvps_avx(auVar133,auVar82,auVar22);
              auVar192 = ZEXT3264(auVar152);
              auVar159 = auVar195;
            }
          }
          auVar216 = ZEXT3264(local_5c0);
          auVar213 = ZEXT3264(local_6c0);
          auVar203 = ZEXT3264(local_720);
          auVar198 = ZEXT3264(local_700);
          if ((((((((auVar159 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar159 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar159 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar159 >> 0x7f,0) == '\0') &&
                (auVar159 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar159 >> 0xbf,0) == '\0') &&
              (auVar159 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar159[0x1f]) goto LAB_0137668d;
          auVar195 = vsubps_avx(ZEXT1632(auVar10),local_760);
          local_2c0 = auVar194._0_32_;
          auVar24 = vfmadd213ps_fma(auVar195,local_2c0,local_760);
          fVar143 = local_728->depth_scale;
          auVar83._4_4_ = (auVar24._4_4_ + auVar24._4_4_) * fVar143;
          auVar83._0_4_ = (auVar24._0_4_ + auVar24._0_4_) * fVar143;
          auVar83._8_4_ = (auVar24._8_4_ + auVar24._8_4_) * fVar143;
          auVar83._12_4_ = (auVar24._12_4_ + auVar24._12_4_) * fVar143;
          auVar83._16_4_ = fVar143 * 0.0;
          auVar83._20_4_ = fVar143 * 0.0;
          auVar83._24_4_ = fVar143 * 0.0;
          auVar83._28_4_ = fVar143;
          local_280 = auVar192._0_32_;
          auVar195 = vcmpps_avx(local_280,auVar83,6);
          auVar133 = auVar159 & auVar195;
          auVar178 = ZEXT3264(CONCAT428(fStack_564,
                                        CONCAT424(fStack_568,
                                                  CONCAT420(fStack_56c,
                                                            CONCAT416(fStack_570,
                                                                      CONCAT412(fStack_574,
                                                                                CONCAT48(fStack_578,
                                                                                         CONCAT44(
                                                  fStack_57c,local_580))))))));
          auVar181 = ZEXT3264(CONCAT428(fStack_584,
                                        CONCAT424(fStack_588,
                                                  CONCAT420(fStack_58c,
                                                            CONCAT416(fStack_590,
                                                                      CONCAT412(fStack_594,
                                                                                CONCAT48(fStack_598,
                                                                                         CONCAT44(
                                                  fStack_59c,local_5a0))))))));
          auVar185 = ZEXT3264(local_640);
          if ((((((((auVar133 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar133 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar133 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar133 >> 0x7f,0) == '\0') &&
                (auVar133 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar133 >> 0xbf,0) == '\0') &&
              (auVar133 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar133[0x1f]) {
            auVar137 = ZEXT3264(local_660);
            goto LAB_013766a8;
          }
          auVar136._8_4_ = 0xbf800000;
          auVar136._0_8_ = 0xbf800000bf800000;
          auVar136._12_4_ = 0xbf800000;
          auVar136._16_4_ = 0xbf800000;
          auVar136._20_4_ = 0xbf800000;
          auVar136._24_4_ = 0xbf800000;
          auVar136._28_4_ = 0xbf800000;
          auVar155._8_4_ = 0x40000000;
          auVar155._0_8_ = 0x4000000040000000;
          auVar155._12_4_ = 0x40000000;
          auVar155._16_4_ = 0x40000000;
          auVar155._20_4_ = 0x40000000;
          auVar155._24_4_ = 0x40000000;
          auVar155._28_4_ = 0x40000000;
          auVar24 = vfmadd213ps_fma(local_3c0,auVar155,auVar136);
          local_2a0 = ZEXT1632(auVar24);
          local_25c = iVar19;
          local_250 = local_600;
          uStack_248 = uStack_5f8;
          local_240 = local_610;
          uStack_238 = uStack_608;
          local_230 = local_620;
          uStack_228 = uStack_618;
          pGVar20 = (context->scene->geometries).items[local_730].ptr;
          local_3c0 = ZEXT1632(auVar24);
          auVar133 = local_3c0;
          if ((pGVar20->mask & ray->mask) == 0) {
            pRVar106 = (RTCIntersectArguments *)0x0;
            auVar137 = ZEXT3264(local_660);
          }
          else {
            pRVar106 = context->args;
            auVar137 = ZEXT3264(local_660);
            if ((pRVar106->filter != (RTCFilterFunctionN)0x0) ||
               (pRVar106 = (RTCIntersectArguments *)CONCAT71((int7)((ulong)pRVar106 >> 8),1),
               pGVar20->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
              local_540 = ZEXT1632(CONCAT88(auVar126._8_8_,pGVar20));
              _auStack_798 = auVar135._8_24_;
              local_7a0 = (undefined1  [8])context;
              auVar135 = vandps_avx(auVar195,auVar159);
              local_6a0 = local_2c0;
              fVar143 = (float)local_260;
              local_1e0[0] = (fVar143 + auVar194._0_4_ + 0.0) * local_180;
              local_1e0[1] = (fVar143 + auVar194._4_4_ + 1.0) * fStack_17c;
              local_1e0[2] = (fVar143 + auVar194._8_4_ + 2.0) * fStack_178;
              local_1e0[3] = (fVar143 + auVar194._12_4_ + 3.0) * fStack_174;
              fStack_1d0 = (fVar143 + auVar194._16_4_ + 4.0) * fStack_170;
              fStack_1cc = (fVar143 + auVar194._20_4_ + 5.0) * fStack_16c;
              fStack_1c8 = (fVar143 + auVar194._24_4_ + 6.0) * fStack_168;
              fStack_1c4 = fVar143 + auVar194._28_4_ + 7.0;
              local_3c0._0_8_ = auVar24._0_8_;
              local_3c0._8_8_ = auVar24._8_8_;
              local_1c0 = local_3c0._0_8_;
              uStack_1b8 = local_3c0._8_8_;
              uStack_1b0 = 0;
              uStack_1a8 = 0;
              local_6e0 = local_280;
              local_1a0 = local_280;
              uVar112 = vmovmskps_avx(auVar135);
              uVar107 = CONCAT44((int)((ulong)pRVar106 >> 0x20),uVar112);
              local_3c0 = auVar133;
              do {
                lVar25 = 0;
                for (uVar109 = uVar107; (uVar109 & 1) == 0;
                    uVar109 = uVar109 >> 1 | 0x8000000000000000) {
                  lVar25 = lVar25 + 1;
                }
                local_760._0_8_ = lVar25;
                local_780._0_8_ = uVar107;
                if (uVar107 == 0) {
                  pRVar106 = (RTCIntersectArguments *)0x0;
                  goto LAB_01376ac3;
                }
                local_4f4 = local_1e0[lVar25];
                local_4f0 = *(undefined4 *)((long)&local_1c0 + lVar25 * 4);
                local_680._0_4_ = ray->tfar;
                ray->tfar = *(float *)(local_1a0 + lVar25 * 4);
                local_5f0.context = *(RTCRayQueryContext **)((long)local_7a0 + 8);
                fVar125 = 1.0 - local_4f4;
                fVar143 = fVar125 * fVar125 * -3.0;
                auVar24 = vfmadd231ss_fma(ZEXT416((uint)(fVar125 * fVar125)),
                                          ZEXT416((uint)(local_4f4 * fVar125)),ZEXT416(0xc0000000));
                auVar10 = vfmsub132ss_fma(ZEXT416((uint)(local_4f4 * fVar125)),
                                          ZEXT416((uint)(local_4f4 * local_4f4)),ZEXT416(0x40000000)
                                         );
                fVar125 = auVar24._0_4_ * 3.0;
                fVar138 = auVar10._0_4_ * 3.0;
                fVar139 = local_4f4 * local_4f4 * 3.0;
                auVar167._0_4_ = fVar139 * local_4c0;
                auVar167._4_4_ = fVar139 * fStack_4bc;
                auVar167._8_4_ = fVar139 * fStack_4b8;
                auVar167._12_4_ = fVar139 * fStack_4b4;
                auVar147._4_4_ = fVar138;
                auVar147._0_4_ = fVar138;
                auVar147._8_4_ = fVar138;
                auVar147._12_4_ = fVar138;
                auVar97._8_8_ = uStack_618;
                auVar97._0_8_ = local_620;
                auVar24 = vfmadd132ps_fma(auVar147,auVar167,auVar97);
                auVar157._4_4_ = fVar125;
                auVar157._0_4_ = fVar125;
                auVar157._8_4_ = fVar125;
                auVar157._12_4_ = fVar125;
                auVar99._8_8_ = uStack_608;
                auVar99._0_8_ = local_610;
                auVar24 = vfmadd132ps_fma(auVar157,auVar24,auVar99);
                auVar148._4_4_ = fVar143;
                auVar148._0_4_ = fVar143;
                auVar148._8_4_ = fVar143;
                auVar148._12_4_ = fVar143;
                auVar101._8_8_ = uStack_5f8;
                auVar101._0_8_ = local_600;
                auVar24 = vfmadd132ps_fma(auVar148,auVar24,auVar101);
                local_500 = vmovlps_avx(auVar24);
                local_4f8 = vextractps_avx(auVar24,2);
                local_4ec = (int)local_4c8;
                local_4e8 = (int)local_730;
                local_4e4 = (local_5f0.context)->instID[0];
                local_4e0 = (local_5f0.context)->instPrimID[0];
                local_7b4 = -1;
                local_5f0.valid = &local_7b4;
                local_5f0.geometryUserPtr = *(void **)(local_540._0_8_ + 0x18);
                local_5f0.ray = (RTCRayN *)ray;
                local_5f0.hit = (RTCHitN *)&local_500;
                local_5f0.N = 1;
                if ((*(code **)(local_540._0_8_ + 0x48) == (code *)0x0) ||
                   ((**(code **)(local_540._0_8_ + 0x48))(&local_5f0), *local_5f0.valid != 0)) {
                  p_Var21 = (*(RTCIntersectArguments **)((long)local_7a0 + 0x10))->filter;
                  if ((p_Var21 == (RTCFilterFunctionN)0x0) ||
                     ((((*(RTCIntersectArguments **)((long)local_7a0 + 0x10))->flags &
                       RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) == RTC_RAY_QUERY_FLAG_INCOHERENT
                      && ((*(byte *)(local_540._0_8_ + 0x3e) & 0x40) == 0)))) goto LAB_01376abd;
                  (*p_Var21)(&local_5f0);
                  if (*local_5f0.valid != 0) goto LAB_01376abd;
                }
                ray->tfar = (float)local_680._0_4_;
                uVar107 = local_780._0_8_ ^ 1L << (local_760._0_8_ & 0x3f);
              } while( true );
            }
          }
          goto LAB_01376a71;
        }
        auVar192 = ZEXT3264(auVar189);
LAB_0137668d:
        auVar216 = ZEXT3264(local_5c0);
        auVar213 = ZEXT3264(local_6c0);
        auVar203 = ZEXT3264(local_720);
        auVar198 = ZEXT3264(local_700);
        auVar137 = ZEXT3264(local_660);
        auVar178 = ZEXT3264(CONCAT428(fStack_564,
                                      CONCAT424(fStack_568,
                                                CONCAT420(fStack_56c,
                                                          CONCAT416(fStack_570,
                                                                    CONCAT412(fStack_574,
                                                                              CONCAT48(fStack_578,
                                                                                       CONCAT44(
                                                  fStack_57c,local_580))))))));
        auVar181 = ZEXT3264(CONCAT428(fStack_584,
                                      CONCAT424(fStack_588,
                                                CONCAT420(fStack_58c,
                                                          CONCAT416(fStack_590,
                                                                    CONCAT412(fStack_594,
                                                                              CONCAT48(fStack_598,
                                                                                       CONCAT44(
                                                  fStack_59c,local_5a0))))))));
        auVar185 = ZEXT3264(local_640);
        goto LAB_013766a8;
      }
    }
    if (bVar111 != 0) break;
    fVar143 = ray->tfar;
    auVar123._4_4_ = fVar143;
    auVar123._0_4_ = fVar143;
    auVar123._8_4_ = fVar143;
    auVar123._12_4_ = fVar143;
    auVar123._16_4_ = fVar143;
    auVar123._20_4_ = fVar143;
    auVar123._24_4_ = fVar143;
    auVar123._28_4_ = fVar143;
    auVar135 = vcmpps_avx(local_80,auVar123,2);
    uVar105 = vmovmskps_avx(auVar135);
    local_4a8 = (ulong)((uint)uVar113 & uVar105);
  }
  return local_4a8 != 0;
LAB_01376abd:
  pRVar106 = (RTCIntersectArguments *)0x1;
LAB_01376ac3:
  auVar194 = ZEXT3264(local_6a0);
  auVar192 = ZEXT3264(local_6e0);
  auVar198 = ZEXT3264(local_700);
  auVar203 = ZEXT3264(local_720);
  auVar137 = ZEXT3264(local_660);
  auVar213 = ZEXT3264(local_6c0);
  auVar216 = ZEXT3264(local_5c0);
  auVar178 = ZEXT3264(CONCAT428(fStack_564,
                                CONCAT424(fStack_568,
                                          CONCAT420(fStack_56c,
                                                    CONCAT416(fStack_570,
                                                              CONCAT412(fStack_574,
                                                                        CONCAT48(fStack_578,
                                                                                 CONCAT44(fStack_57c
                                                                                          ,local_580
                                                                                         ))))))));
  auVar181 = ZEXT3264(CONCAT428(fStack_584,
                                CONCAT424(fStack_588,
                                          CONCAT420(fStack_58c,
                                                    CONCAT416(fStack_590,
                                                              CONCAT412(fStack_594,
                                                                        CONCAT48(fStack_598,
                                                                                 CONCAT44(fStack_59c
                                                                                          ,local_5a0
                                                                                         ))))))));
  auVar185 = ZEXT3264(local_640);
  context = (RayQueryContext *)local_7a0;
LAB_01376a71:
  bVar111 = bVar111 | (byte)pRVar106;
LAB_013766a8:
  lVar108 = lVar108 + 8;
  auVar160 = ZEXT3264(local_520);
  goto LAB_01375ebc;
}

Assistant:

static __forceinline bool occluded_t(const Precalculations& pre, Ray& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID));
         
          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }

          if (Intersector().intersect(pre,ray,context,geom,primID,a0,a1,a2,a3,Epilog(ray,context,geomID,primID)))
            return true;
          
          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
        return false;
      }